

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

uchar * stbi__load_main(stbi__context *s,int *x,int *y,int *comp,int req_comp)

{
  anon_struct_96_18_0d0905d3 *paVar1;
  undefined1 uVar2;
  short sVar3;
  stbi__uint32 sVar4;
  char *pcVar5;
  int *piVar6;
  bool bVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  byte bVar29;
  short sVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  stbi_uc sVar34;
  byte bVar35;
  char cVar36;
  uchar uVar37;
  int iVar38;
  stbi__gif_lzw sVar39;
  stbi__gif_lzw sVar40;
  uint uVar41;
  stbi__gif_lzw sVar42;
  stbi__gif_lzw sVar43;
  stbi__gif_lzw sVar44;
  int iVar45;
  uint extraout_EAX;
  int iVar46;
  uint uVar47;
  uint uVar48;
  uint uVar49;
  stbi__gif *g;
  byte *pbVar50;
  byte *pbVar51;
  uchar *puVar52;
  void *pvVar53;
  code *pcVar54;
  stbi__context *data;
  undefined8 *puVar55;
  undefined8 uVar56;
  uchar *puVar57;
  float *data_00;
  stbi_uc *psVar58;
  stbi_uc *psVar59;
  stbi_uc *psVar60;
  stbi__gif_lzw sVar63;
  byte bVar61;
  undefined2 uVar62;
  int iVar64;
  uint uVar65;
  uint uVar66;
  long lVar67;
  undefined8 *puVar68;
  int iVar69;
  int iVar70;
  uint uVar71;
  stbi__gif_lzw sVar77;
  stbi__gif_lzw sVar78;
  short *psVar72;
  int iVar73;
  size_t __size;
  uint uVar74;
  ulong uVar75;
  stbi_uc *psVar76;
  uint uVar79;
  long lVar80;
  stbi__uint32 sVar81;
  anon_struct_96_18_0d0905d3 *paVar82;
  ulong uVar83;
  long lVar84;
  long lVar85;
  uint uVar86;
  ulong uVar87;
  ulong uVar88;
  code *data_01;
  stbi__bmp_data *psVar89;
  uint uVar90;
  uint *puVar91;
  stbi_uc (*pal) [4];
  bool bVar92;
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  int iVar135;
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  stbi_uc *coutput [4];
  stbi__jpeg j;
  uint local_48d8;
  int local_48bc;
  undefined8 local_48a8;
  uint local_4870;
  uint local_4868;
  uint local_4844;
  int local_4840;
  stbi__bmp_data local_47d8;
  undefined1 local_47b8 [28];
  int aiStack_479c [4547];
  uchar local_90;
  code *local_50;
  code *local_48;
  code *local_40;
  
  local_50 = stbi__idct_block;
  data_01 = stbi__YCbCr_to_RGB_row;
  local_48 = stbi__YCbCr_to_RGB_row;
  local_40 = stbi__resample_row_hv_2;
  local_90 = 0xff;
  local_47b8._0_8_ = s;
  sVar34 = stbi__get_marker((stbi__jpeg *)local_47b8);
  if (sVar34 == 0xd8) {
    s->img_buffer = s->img_buffer_original;
    s->img_buffer_end = s->img_buffer_original_end;
    g = (stbi__gif *)malloc(0x4780);
    *(stbi__context **)g = s;
    *(code **)(g->codes + 0xfce) = stbi__idct_block;
    *(code **)(g->codes + 0xfd0) = stbi__YCbCr_to_RGB_row;
    *(code **)(g->codes + 0xfd2) = stbi__resample_row_hv_2;
    s->img_n = 0;
    if ((uint)req_comp < 5) {
      g->codes[0xf6a].prefix = 0;
      g->codes[0xf6a].first = '\0';
      g->codes[0xf6a].suffix = '\0';
      g->codes[0xf6b].prefix = 0;
      g->codes[0xf6b].first = '\0';
      g->codes[0xf6b].suffix = '\0';
      g->codes[0xf6c].prefix = 0;
      g->codes[0xf6c].first = '\0';
      g->codes[0xf6c].suffix = '\0';
      g->codes[0xf6d].prefix = 0;
      g->codes[0xf6d].first = '\0';
      g->codes[0xf6d].suffix = '\0';
      g->codes[0xf82].prefix = 0;
      g->codes[0xf82].first = '\0';
      g->codes[0xf82].suffix = '\0';
      g->codes[0xf83].prefix = 0;
      g->codes[0xf83].first = '\0';
      g->codes[0xf83].suffix = '\0';
      g->codes[0xf84].prefix = 0;
      g->codes[0xf84].first = '\0';
      g->codes[0xf84].suffix = '\0';
      g->codes[0xf85].prefix = 0;
      g->codes[0xf85].first = '\0';
      g->codes[0xf85].suffix = '\0';
      g->codes[0xf9a].prefix = 0;
      g->codes[0xf9a].first = '\0';
      g->codes[0xf9a].suffix = '\0';
      g->codes[0xf9b].prefix = 0;
      g->codes[0xf9b].first = '\0';
      g->codes[0xf9b].suffix = '\0';
      g->codes[0xf9c].prefix = 0;
      g->codes[0xf9c].first = '\0';
      g->codes[0xf9c].suffix = '\0';
      g->codes[0xf9d].prefix = 0;
      g->codes[0xf9d].first = '\0';
      g->codes[0xf9d].suffix = '\0';
      g->codes[0xfb2].prefix = 0;
      g->codes[0xfb2].first = '\0';
      g->codes[0xfb2].suffix = '\0';
      g->codes[0xfb3].prefix = 0;
      g->codes[0xfb3].first = '\0';
      g->codes[0xfb3].suffix = '\0';
      g->codes[0xfb4].prefix = 0;
      g->codes[0xfb4].first = '\0';
      g->codes[0xfb4].suffix = '\0';
      g->codes[0xfb5].prefix = 0;
      g->codes[0xfb5].first = '\0';
      g->codes[0xfb5].suffix = '\0';
      g->codes[0xfcc].prefix = 0;
      g->codes[0xfcc].first = '\0';
      g->codes[0xfcc].suffix = '\0';
      iVar38 = stbi__decode_jpeg_header((stbi__jpeg *)g,0);
      if (iVar38 != 0) {
        paVar1 = (anon_struct_96_18_0d0905d3 *)(g->codes + 0xf5c);
        bVar35 = stbi__get_marker((stbi__jpeg *)g);
LAB_001139be:
        if (bVar35 != 0xda) {
          if (bVar35 == 0xd9) {
            puVar91 = *(uint **)g;
            uVar74 = puVar91[2];
            if (0 < (int)uVar74 && g->codes[0xfc0] != (stbi__gif_lzw)0x0) {
              lVar80 = 0;
              do {
                uVar74 = (int)g->codes[lVar80 * 0x18 + 0xf64] + 7 >> 3;
                if (0 < (int)uVar74) {
                  uVar90 = paVar1[lVar80].x + 7 >> 3;
                  data_01 = (code *)0x0;
                  do {
                    iVar38 = (int)data_01;
                    if (0 < (int)uVar90) {
                      uVar88 = 0;
                      do {
                        psVar72 = paVar1[lVar80].coeff +
                                  (paVar1[lVar80].coeff_w * iVar38 + (int)uVar88) * 0x40;
                        iVar46 = paVar1[lVar80].tq;
                        lVar67 = 0;
                        do {
                          psVar72[lVar67] =
                               (ushort)*(byte *)((long)&g->codes[(long)iVar46 * 0x10 + 0xb16].prefix
                                                + lVar67) * psVar72[lVar67];
                          lVar67 = lVar67 + 1;
                        } while (lVar67 != 0x40);
                        (**(_func_void_stbi_uc_ptr_int_short_ptr **)(g->codes + 0xfce))
                                  (paVar1[lVar80].data +
                                   uVar88 * 8 + (long)(iVar38 * 8 * paVar1[lVar80].w2),
                                   paVar1[lVar80].w2,psVar72);
                        uVar88 = uVar88 + 1;
                      } while (uVar88 != uVar90);
                    }
                    data_01 = (code *)(ulong)(iVar38 + 1U);
                  } while (iVar38 + 1U != uVar74);
                  puVar91 = *(uint **)g;
                }
                lVar80 = lVar80 + 1;
                uVar74 = puVar91[2];
              } while (lVar80 < (int)uVar74);
            }
            if (req_comp == 0) {
              req_comp = uVar74;
            }
            uVar90 = 1;
            if (2 < req_comp) {
              uVar90 = uVar74;
            }
            if (uVar74 != 3) {
              uVar90 = uVar74;
            }
            uVar74 = *puVar91;
            if ((int)uVar90 < 1) {
LAB_001156ab:
              uVar79 = puVar91[1];
              data = (stbi__context *)malloc((ulong)(uVar74 * req_comp * uVar79 + 1));
              if (data != (stbi__context *)0x0) {
                if (uVar79 != 0) {
                  iVar38 = 0;
                  uVar74 = 0;
                  do {
                    uVar79 = *puVar91;
                    if (0 < (int)uVar90) {
                      psVar89 = &local_47d8;
                      lVar80 = 0;
                      do {
                        iVar46 = *(int *)((long)aiStack_479c + lVar80 + 8);
                        iVar69 = *(int *)((long)aiStack_479c + lVar80);
                        iVar64 = iVar69 >> 1;
                        puVar68 = (undefined8 *)(local_47b8 + lVar80 + 0x10);
                        if (iVar46 < iVar64) {
                          puVar68 = (undefined8 *)(local_47b8 + lVar80 + 8);
                        }
                        puVar55 = (undefined8 *)(local_47b8 + lVar80 + 0x10);
                        if (iVar64 <= iVar46) {
                          puVar55 = (undefined8 *)(local_47b8 + lVar80 + 8);
                        }
                        uVar56 = (**(code **)(local_47b8 + lVar80))
                                           (*(undefined8 *)
                                             ((long)&g->codes[0xf6e].prefix + lVar80 * 2),*puVar68,
                                            *puVar55,*(undefined4 *)
                                                      ((long)aiStack_479c + lVar80 + 4),
                                            *(undefined4 *)(local_47b8 + lVar80 + 0x18));
                        psVar89->bpp = (int)uVar56;
                        psVar89->offset = (int)((ulong)uVar56 >> 0x20);
                        *(int *)((long)aiStack_479c + lVar80 + 8) = iVar46 + 1;
                        if (iVar69 <= iVar46 + 1) {
                          *(undefined4 *)((long)aiStack_479c + lVar80 + 8) = 0;
                          lVar67 = *(long *)(local_47b8 + lVar80 + 0x10);
                          *(long *)(local_47b8 + lVar80 + 8) = lVar67;
                          iVar46 = *(int *)((long)aiStack_479c + lVar80 + 0xc) + 1;
                          *(int *)((long)aiStack_479c + lVar80 + 0xc) = iVar46;
                          if (iVar46 < *(int *)((long)&g->codes[0xf64].prefix + lVar80 * 2)) {
                            *(long *)(local_47b8 + lVar80 + 0x10) =
                                 lVar67 + *(int *)((long)&g->codes[0xf65].prefix + lVar80 * 2);
                          }
                        }
                        lVar80 = lVar80 + 0x30;
                        psVar89 = (stbi__bmp_data *)&psVar89->hsz;
                      } while ((ulong)uVar90 * 0x30 != lVar80);
                      data_01 = (code *)CONCAT44(local_47d8.offset,local_47d8.bpp);
                      puVar91 = *(uint **)g;
                    }
                    if (req_comp < 3) {
                      if (req_comp == 1) {
                        if (*puVar91 != 0) {
                          uVar88 = 0;
                          do {
                            data->buffer_start[uVar88 + uVar79 * iVar38 + -0x38] =
                                 *(stbi_uc *)
                                  ((long)&((stbi__gif *)(((stbi__gif *)data_01)->pal + -0xc))->w +
                                  uVar88);
                            uVar88 = uVar88 + 1;
                          } while (uVar88 < *puVar91);
                        }
                      }
                      else if (*puVar91 != 0) {
                        uVar88 = 0;
                        do {
                          data->buffer_start[uVar88 * 2 + (ulong)(uVar79 * iVar38) + -0x38] =
                               *(stbi_uc *)
                                ((long)&((stbi__gif *)(((stbi__gif *)data_01)->pal + -0xc))->w +
                                uVar88);
                          data->buffer_start[uVar88 * 2 + (ulong)(uVar79 * iVar38) + -0x37] = 0xff;
                          uVar88 = uVar88 + 1;
                        } while (uVar88 < *puVar91);
                      }
                    }
                    else if (puVar91[2] == 3) {
                      if (g->codes[0xfc6] == (stbi__gif_lzw)0x3) {
                        if (*puVar91 != 0) {
                          psVar76 = data->buffer_start + ((ulong)(uVar79 * iVar38) - 0x35);
                          uVar88 = 0;
                          do {
                            psVar76[-3] = *(undefined1 *)
                                           ((long)&((stbi__gif *)
                                                   (((stbi__gif *)data_01)->pal + -0xc))->w + uVar88
                                           );
                            psVar76[-2] = *(undefined1 *)
                                           (CONCAT44(local_47d8.mr,local_47d8.hsz) + uVar88);
                            psVar76[-1] = *(undefined1 *)
                                           (CONCAT44(local_47d8.mb,local_47d8.mg) + uVar88);
                            *psVar76 = 0xff;
                            uVar88 = uVar88 + 1;
                            psVar76 = psVar76 + (uint)req_comp;
                          } while (uVar88 < *puVar91);
                        }
                      }
                      else {
                        (**(_func_void_stbi_uc_ptr_stbi_uc_ptr_stbi_uc_ptr_stbi_uc_ptr_int_int **)
                           (g->codes + 0xfd0))
                                  (data->buffer_start + ((ulong)(uVar74 * req_comp * uVar79) - 0x38)
                                   ,(stbi_uc *)data_01,
                                   (stbi_uc *)CONCAT44(local_47d8.mr,local_47d8.hsz),
                                   (stbi_uc *)CONCAT44(local_47d8.mb,local_47d8.mg),*puVar91,
                                   req_comp);
                        puVar91 = *(uint **)g;
                      }
                    }
                    else if (*puVar91 != 0) {
                      psVar76 = data->buffer_start + ((ulong)(uVar79 * iVar38) - 0x35);
                      uVar88 = 0;
                      do {
                        uVar2 = *(undefined1 *)
                                 ((long)&((stbi__gif *)(((stbi__gif *)data_01)->pal + -0xc))->w +
                                 uVar88);
                        psVar76[-1] = uVar2;
                        psVar76[-2] = uVar2;
                        psVar76[-3] = uVar2;
                        *psVar76 = 0xff;
                        uVar88 = uVar88 + 1;
                        psVar76 = psVar76 + (uint)req_comp;
                      } while (uVar88 < *puVar91);
                    }
                    uVar74 = uVar74 + 1;
                    iVar38 = iVar38 + req_comp;
                  } while (uVar74 < puVar91[1]);
                }
                stbi__cleanup_jpeg((stbi__jpeg *)g);
                piVar6 = *(int **)g;
                *x = *piVar6;
                *y = piVar6[1];
                if (comp != (int *)0x0) {
                  *comp = piVar6[2];
                }
                goto LAB_00115cbb;
              }
              stbi__cleanup_jpeg((stbi__jpeg *)g);
            }
            else {
              data_01 = (code *)(ulong)(uVar74 + 3);
              lVar80 = 0;
              while( true ) {
                pvVar53 = malloc((size_t)data_01);
                *(void **)((long)&g->codes[0xf6e].prefix + lVar80 * 2) = pvVar53;
                if (pvVar53 == (void *)0x0) break;
                uVar88 = (long)(int)g->codes[0xf56] /
                         (long)*(int *)((long)&g->codes[0xf5d].prefix + lVar80 * 2);
                iVar38 = (int)uVar88;
                *(int *)(local_47b8 + lVar80 + 0x18) = iVar38;
                iVar46 = (int)g->codes[0xf57] / *(int *)((long)&g->codes[0xf5e].prefix + lVar80 * 2)
                ;
                *(int *)((long)aiStack_479c + lVar80) = iVar46;
                *(int *)((long)aiStack_479c + lVar80 + 8) = iVar46 >> 1;
                *(int *)((long)aiStack_479c + lVar80 + 4) =
                     (int)((ulong)((uVar74 - 1) + iVar38) / (uVar88 & 0xffffffff));
                *(undefined4 *)((long)aiStack_479c + lVar80 + 0xc) = 0;
                uVar56 = *(undefined8 *)((long)&g->codes[0xf68].prefix + lVar80 * 2);
                *(undefined8 *)(local_47b8 + lVar80 + 0x10) = uVar56;
                *(undefined8 *)(local_47b8 + lVar80 + 8) = uVar56;
                if (iVar38 == 2) {
                  pcVar54 = stbi__resample_row_h_2;
                  if (iVar46 != 1) {
                    if (iVar46 != 2) goto LAB_0011568f;
                    pcVar54 = *(code **)(g->codes + 0xfd2);
                  }
                }
                else if (iVar38 == 1) {
                  pcVar54 = stbi__resample_row_generic;
                  if (iVar46 == 2) {
                    pcVar54 = stbi__resample_row_v_2;
                  }
                  if (iVar46 == 1) {
                    pcVar54 = resample_row_1;
                  }
                }
                else {
LAB_0011568f:
                  pcVar54 = stbi__resample_row_generic;
                }
                *(code **)(local_47b8 + lVar80) = pcVar54;
                lVar80 = lVar80 + 0x30;
                if ((ulong)uVar90 * 0x30 == lVar80) goto LAB_001156ab;
              }
              stbi__cleanup_jpeg((stbi__jpeg *)g);
            }
            stbi__g_failure_reason = "outofmem";
            goto LAB_00115cb9;
          }
          iVar38 = stbi__process_marker((stbi__jpeg *)g,(uint)bVar35);
          if (iVar38 != 0) goto LAB_001139e3;
          goto LAB_00115cac;
        }
        iVar38 = stbi__get16be(*(stbi__context **)g);
        lVar80 = *(long *)g;
        pbVar51 = *(byte **)(lVar80 + 0xb8);
        if (pbVar51 < *(byte **)(lVar80 + 0xc0)) {
          *(byte **)(lVar80 + 0xb8) = pbVar51 + 1;
          bVar35 = *pbVar51;
LAB_00113a75:
          sVar39._1_3_ = 0;
          sVar39.prefix._0_1_ = bVar35;
          g->codes[0xfc7] = sVar39;
          if ((0xfb < (byte)(bVar35 - 5)) &&
             (lVar80 = *(long *)g, (int)(uint)bVar35 <= *(int *)(lVar80 + 8))) {
            if (iVar38 != (uint)bVar35 * 2 + 6) {
              stbi__g_failure_reason = "bad SOS len";
              goto LAB_00115cac;
            }
            lVar67 = 0;
            do {
              pbVar50 = *(byte **)(lVar80 + 0xb8);
              pbVar51 = *(byte **)(lVar80 + 0xc0);
              if (pbVar50 < pbVar51) {
                *(byte **)(lVar80 + 0xb8) = pbVar50 + 1;
                uVar74 = (uint)*pbVar50;
                pbVar50 = pbVar50 + 1;
              }
              else if (*(int *)(lVar80 + 0x30) == 0) {
                uVar74 = 0;
              }
              else {
                data_01 = (code *)(lVar80 + 0x38);
                iVar38 = (**(code **)(lVar80 + 0x10))
                                   (*(undefined8 *)(lVar80 + 0x28),data_01,
                                    *(undefined4 *)(lVar80 + 0x34));
                if (iVar38 == 0) {
                  *(undefined4 *)(lVar80 + 0x30) = 0;
                  lVar84 = lVar80 + 0x39;
                  *(undefined1 *)(lVar80 + 0x38) = 0;
                  uVar74 = 0;
                }
                else {
                  lVar84 = (long)&((stbi__gif *)(((stbi__gif *)data_01)->pal + -0xc))->w +
                           (long)iVar38;
                  uVar74 = (uint)*(byte *)&((stbi__gif *)data_01)->w;
                }
                *(long *)(lVar80 + 0xc0) = lVar84;
                *(long *)(lVar80 + 0xb8) = lVar80 + 0x39;
                lVar80 = *(long *)g;
                pbVar50 = *(byte **)(lVar80 + 0xb8);
                pbVar51 = *(byte **)(lVar80 + 0xc0);
              }
              if (pbVar50 < pbVar51) {
                *(byte **)(lVar80 + 0xb8) = pbVar50 + 1;
                bVar35 = *pbVar50;
              }
              else if (*(int *)(lVar80 + 0x30) == 0) {
                bVar35 = 0;
              }
              else {
                data_01 = (code *)(lVar80 + 0x38);
                iVar38 = (**(code **)(lVar80 + 0x10))
                                   (*(undefined8 *)(lVar80 + 0x28),data_01,
                                    *(undefined4 *)(lVar80 + 0x34));
                if (iVar38 == 0) {
                  *(undefined4 *)(lVar80 + 0x30) = 0;
                  lVar84 = lVar80 + 0x39;
                  *(undefined1 *)(lVar80 + 0x38) = 0;
                  bVar35 = 0;
                }
                else {
                  lVar84 = (long)&((stbi__gif *)(((stbi__gif *)data_01)->pal + -0xc))->w +
                           (long)iVar38;
                  bVar35 = *(byte *)&((stbi__gif *)data_01)->w;
                }
                *(long *)(lVar80 + 0xc0) = lVar84;
                *(long *)(lVar80 + 0xb8) = lVar80 + 0x39;
                lVar80._0_4_ = g->w;
                lVar80._4_4_ = g->h;
              }
              sVar39 = *(stbi__gif_lzw *)(lVar80 + 8);
              if ((long)(int)sVar39 < 1) {
                uVar88 = 0;
              }
              else {
                uVar88 = 0;
                paVar82 = paVar1;
                while (paVar82->id != uVar74) {
                  uVar88 = uVar88 + 1;
                  paVar82 = paVar82 + 1;
                  if ((long)(int)sVar39 == uVar88) goto LAB_00115cac;
                }
              }
              if (SUB84(uVar88,0) == sVar39) goto LAB_00115cac;
              sVar77._1_3_ = 0;
              sVar77.prefix._0_1_ = bVar35 >> 4;
              g->codes[(uVar88 & 0xffffffff) * 0x18 + 0xf60] = sVar77;
              if (0x3f < bVar35) {
                stbi__g_failure_reason = "bad DC huff";
                goto LAB_00115cac;
              }
              paVar1[uVar88 & 0xffffffff].ha = bVar35 & 0xf;
              if (3 < (bVar35 & 0xf)) {
                stbi__g_failure_reason = "bad AC huff";
                goto LAB_00115cac;
              }
              g->codes[lVar67 + 0xfc8] = SUB84(uVar88,0);
              lVar67 = lVar67 + 1;
            } while (lVar67 < (int)g->codes[0xfc7]);
            pbVar51 = *(byte **)(lVar80 + 0xb8);
            pbVar50 = *(byte **)(lVar80 + 0xc0);
            if (pbVar51 < pbVar50) {
              *(byte **)(lVar80 + 0xb8) = pbVar51 + 1;
              bVar35 = *pbVar51;
              pbVar51 = pbVar51 + 1;
            }
            else if (*(int *)(lVar80 + 0x30) == 0) {
              bVar35 = 0;
            }
            else {
              data_01 = (code *)(lVar80 + 0x38);
              iVar38 = (**(code **)(lVar80 + 0x10))
                                 (*(undefined8 *)(lVar80 + 0x28),data_01,
                                  *(undefined4 *)(lVar80 + 0x34));
              if (iVar38 == 0) {
                *(undefined4 *)(lVar80 + 0x30) = 0;
                lVar67 = lVar80 + 0x39;
                *(undefined1 *)(lVar80 + 0x38) = 0;
                bVar35 = 0;
              }
              else {
                lVar67 = (long)&((stbi__gif *)(((stbi__gif *)data_01)->pal + -0xc))->w +
                         (long)iVar38;
                bVar35 = *(byte *)&((stbi__gif *)data_01)->w;
              }
              *(long *)(lVar80 + 0xc0) = lVar67;
              *(long *)(lVar80 + 0xb8) = lVar80 + 0x39;
              lVar80 = *(long *)g;
              pbVar51 = *(byte **)(lVar80 + 0xb8);
              pbVar50 = *(byte **)(lVar80 + 0xc0);
            }
            sVar78._1_3_ = 0;
            sVar78.prefix._0_1_ = bVar35;
            g->codes[0xfc1] = sVar78;
            if (pbVar51 < pbVar50) {
              *(byte **)(lVar80 + 0xb8) = pbVar51 + 1;
              sVar40._1_3_ = 0;
              sVar40.prefix._0_1_ = *pbVar51;
              pbVar51 = pbVar51 + 1;
            }
            else if (*(int *)(lVar80 + 0x30) == 0) {
              sVar40.prefix = 0;
              sVar40.first = '\0';
              sVar40.suffix = '\0';
            }
            else {
              data_01 = (code *)(lVar80 + 0x38);
              iVar38 = (**(code **)(lVar80 + 0x10))
                                 (*(undefined8 *)(lVar80 + 0x28),data_01,
                                  *(undefined4 *)(lVar80 + 0x34));
              if (iVar38 == 0) {
                *(undefined4 *)(lVar80 + 0x30) = 0;
                lVar67 = lVar80 + 0x39;
                *(undefined1 *)(lVar80 + 0x38) = 0;
                sVar40.prefix = 0;
                sVar40.first = '\0';
                sVar40.suffix = '\0';
              }
              else {
                lVar67 = (long)&((stbi__gif *)(((stbi__gif *)data_01)->pal + -0xc))->w +
                         (long)iVar38;
                sVar40._1_3_ = 0;
                sVar40.prefix._0_1_ = *(byte *)&((stbi__gif *)data_01)->w;
              }
              *(long *)(lVar80 + 0xc0) = lVar67;
              *(long *)(lVar80 + 0xb8) = lVar80 + 0x39;
              lVar80 = *(long *)g;
              pbVar51 = *(byte **)(lVar80 + 0xb8);
              pbVar50 = *(byte **)(lVar80 + 0xc0);
            }
            g->codes[0xfc2] = sVar40;
            if (pbVar51 < pbVar50) {
              *(byte **)(lVar80 + 0xb8) = pbVar51 + 1;
              bVar35 = *pbVar51;
            }
            else if (*(int *)(lVar80 + 0x30) == 0) {
              bVar35 = 0;
            }
            else {
              data_01 = (code *)(lVar80 + 0x38);
              iVar38 = (**(code **)(lVar80 + 0x10))
                                 (*(undefined8 *)(lVar80 + 0x28),data_01,
                                  *(undefined4 *)(lVar80 + 0x34));
              if (iVar38 == 0) {
                *(undefined4 *)(lVar80 + 0x30) = 0;
                lVar67 = lVar80 + 0x39;
                *(undefined1 *)(lVar80 + 0x38) = 0;
                bVar35 = 0;
              }
              else {
                lVar67 = (long)&((stbi__gif *)(((stbi__gif *)data_01)->pal + -0xc))->w +
                         (long)iVar38;
                bVar35 = *(byte *)&((stbi__gif *)data_01)->w;
              }
              *(long *)(lVar80 + 0xc0) = lVar67;
              *(long *)(lVar80 + 0xb8) = lVar80 + 0x39;
            }
            sVar63._1_3_ = 0;
            sVar63.prefix._0_1_ = bVar35 >> 4;
            g->codes[0xfc3] = sVar63;
            g->codes[0xfc4] = (stbi__gif_lzw)(bVar35 & 0xf);
            sVar39 = g->codes[0xfc0];
            sVar77 = g->codes[0xfc1];
            if (sVar39 == (stbi__gif_lzw)0x0) {
              if ((sVar77 != (stbi__gif_lzw)0x0) || ((0xf < bVar35 || ((bVar35 & 0xf) != 0)))) {
LAB_00116dec:
                stbi__g_failure_reason = "bad SOS";
                goto LAB_00115cac;
              }
              g->codes[0xfc2].prefix = 0x3f;
              g->codes[0xfc2].first = '\0';
              g->codes[0xfc2].suffix = '\0';
            }
            else if ((((0x3f < (int)sVar77) || (0x3f < (int)g->codes[0xfc2])) ||
                     ((int)g->codes[0xfc2] < (int)sVar77)) ||
                    ((0xdf < bVar35 || (0xd < (bVar35 & 0xf))))) goto LAB_00116dec;
            sVar77 = g->codes[0xfc7];
            sVar44 = g->codes[0xfcc];
            if (sVar44 == (stbi__gif_lzw)0x0) {
              sVar44.prefix = -1;
              sVar44.first = 0xff;
              sVar44.suffix = '\x7f';
            }
            g->codes[0xfbc].prefix = 0;
            g->codes[0xfbc].first = '\0';
            g->codes[0xfbc].suffix = '\0';
            g->codes[0xfbd].prefix = 0;
            g->codes[0xfbd].first = '\0';
            g->codes[0xfbd].suffix = '\0';
            g->codes[0xfbf].prefix = 0;
            g->codes[0xfbf].first = '\0';
            g->codes[0xfbf].suffix = '\0';
            g->codes[0xf92].prefix = 0;
            g->codes[0xf92].first = '\0';
            g->codes[0xf92].suffix = '\0';
            g->codes[0xf7a].prefix = 0;
            g->codes[0xf7a].first = '\0';
            g->codes[0xf7a].suffix = '\0';
            g->codes[0xf62].prefix = 0;
            g->codes[0xf62].first = '\0';
            g->codes[0xf62].suffix = '\0';
            *(uchar *)&g->codes[0xfbe].prefix = 0xff;
            g->codes[0xfcd] = sVar44;
            g->codes[0xfc5].prefix = 0;
            g->codes[0xfc5].first = '\0';
            g->codes[0xfc5].suffix = '\0';
            if (sVar39 == (stbi__gif_lzw)0x0) {
              if (sVar77 == (stbi__gif_lzw)0x1) {
                sVar39 = g->codes[0xfc8];
                lVar80 = (long)(int)sVar39;
                iVar38 = (int)g->codes[lVar80 * 0x18 + 0xf64] + 7 >> 3;
                bVar92 = true;
                if (0 < iVar38) {
                  uVar74 = paVar1[lVar80].x + 7 >> 3;
                  iVar69 = 0;
                  iVar46 = 0;
                  do {
                    if (0 < (int)uVar74) {
                      lVar67 = 0;
                      do {
                        data_01 = (code *)local_47b8;
                        iVar64 = stbi__jpeg_decode_block
                                           ((stbi__jpeg *)g,(short *)data_01,
                                            (stbi__huffman *)
                                            (g->pal + (long)paVar1[lVar80].hd * 0x1a4 + -10),
                                            (stbi__huffman *)
                                            (g->codes + (long)paVar1[lVar80].ha * 0x1a4 + 0x486),
                                            &g->codes[(long)paVar1[lVar80].ha * 0x100 + 0xb56].
                                             prefix,(int)sVar39,
                                            (stbi_uc *)
                                            (g->codes + (long)paVar1[lVar80].tq * 0x10 + 0xb16));
                        if (iVar64 == 0) {
                          bVar92 = false;
                          goto LAB_00114ce0;
                        }
                        (**(_func_void_stbi_uc_ptr_int_short_ptr **)(g->codes + 0xfce))
                                  (paVar1[lVar80].data + lVar67 + iVar69 * paVar1[lVar80].w2,
                                   paVar1[lVar80].w2,(short *)data_01);
                        sVar77 = g->codes[0xfcd];
                        g->codes[0xfcd] = (stbi__gif_lzw)((int)sVar77 + -1);
                        if ((int)sVar77 < 2) {
                          if ((int)g->codes[0xfbd] < 0x18) {
                            stbi__grow_buffer_unsafe((stbi__jpeg *)g);
                          }
                          if ((g->codes[0xfbe].prefix & 0xf8) != 0xd0) goto LAB_001148c4;
                          g->codes[0xfbc].prefix = 0;
                          g->codes[0xfbc].first = '\0';
                          g->codes[0xfbc].suffix = '\0';
                          g->codes[0xfbd].prefix = 0;
                          g->codes[0xfbd].first = '\0';
                          g->codes[0xfbd].suffix = '\0';
                          g->codes[0xfbf].prefix = 0;
                          g->codes[0xfbf].first = '\0';
                          g->codes[0xfbf].suffix = '\0';
                          g->codes[0xf92].prefix = 0;
                          g->codes[0xf92].first = '\0';
                          g->codes[0xf92].suffix = '\0';
                          g->codes[0xf7a].prefix = 0;
                          g->codes[0xf7a].first = '\0';
                          g->codes[0xf7a].suffix = '\0';
                          g->codes[0xf62].prefix = 0;
                          g->codes[0xf62].first = '\0';
                          g->codes[0xf62].suffix = '\0';
                          *(uchar *)&g->codes[0xfbe].prefix = 0xff;
                          sVar43 = g->codes[0xfcc];
                          if (sVar43 == (stbi__gif_lzw)0x0) {
                            sVar43.prefix = -1;
                            sVar43.first = 0xff;
                            sVar43.suffix = '\x7f';
                          }
                          g->codes[0xfcd] = sVar43;
                          g->codes[0xfc5].prefix = 0;
                          g->codes[0xfc5].first = '\0';
                          g->codes[0xfc5].suffix = '\0';
                        }
                        lVar67 = lVar67 + 8;
                      } while ((ulong)uVar74 * 8 != lVar67);
                    }
                    iVar46 = iVar46 + 1;
                    iVar69 = iVar69 + 8;
                  } while (iVar46 != iVar38);
LAB_001148c4:
                  bVar92 = true;
                }
              }
              else {
                sVar39 = g->codes[0xf59];
                bVar92 = true;
                if (0 < (int)sVar39) {
                  sVar77 = g->codes[0xf58];
                  iVar38 = 0;
                  do {
                    if (0 < (int)sVar77) {
                      iVar46 = 0;
                      do {
                        sVar39 = g->codes[0xfc7];
                        if (0 < (int)sVar39) {
                          lVar80 = 0;
                          do {
                            sVar77 = g->codes[lVar80 + 0xfc8];
                            lVar67 = (long)(int)sVar77;
                            sVar78 = g->codes[lVar67 * 0x18 + 0xf5e];
                            if (0 < (int)sVar78) {
                              iVar69 = paVar1[lVar67].h;
                              iVar64 = 0;
                              do {
                                if (0 < iVar69) {
                                  data_01 = (code *)0x0;
                                  do {
                                    iVar73 = paVar1[lVar67].v;
                                    iVar45 = stbi__jpeg_decode_block
                                                       ((stbi__jpeg *)g,(short *)local_47b8,
                                                        (stbi__huffman *)
                                                        (g->pal + (long)paVar1[lVar67].hd * 0x1a4 +
                                                                  -10),
                                                        (stbi__huffman *)
                                                        (g->codes +
                                                        (long)paVar1[lVar67].ha * 0x1a4 + 0x486),
                                                        &g->codes[(long)paVar1[lVar67].ha * 0x100 +
                                                                  0xb56].prefix,(int)sVar77,
                                                        (stbi_uc *)
                                                        (g->codes +
                                                        (long)paVar1[lVar67].tq * 0x10 + 0xb16));
                                    if (iVar45 == 0) {
                                      bVar92 = false;
                                      goto LAB_00114ce0;
                                    }
                                    (**(_func_void_stbi_uc_ptr_int_short_ptr **)(g->codes + 0xfce))
                                              (paVar1[lVar67].data +
                                               (long)((iVar69 * iVar46 + (int)data_01) * 8) +
                                               (long)((iVar73 * iVar38 + iVar64) * paVar1[lVar67].w2
                                                     * 8),paVar1[lVar67].w2,(short *)local_47b8);
                                    uVar74 = (int)data_01 + 1;
                                    data_01 = (code *)(ulong)uVar74;
                                    iVar69 = paVar1[lVar67].h;
                                  } while ((int)uVar74 < iVar69);
                                  sVar78 = (stbi__gif_lzw)paVar1[lVar67].v;
                                }
                                iVar64 = iVar64 + 1;
                              } while (iVar64 < (int)sVar78);
                              sVar39 = g->codes[0xfc7];
                            }
                            lVar80 = lVar80 + 1;
                          } while (lVar80 < (int)sVar39);
                          sVar44 = g->codes[0xfcd];
                        }
                        bVar92 = true;
                        g->codes[0xfcd] = (stbi__gif_lzw)((int)sVar44 + -1);
                        bVar7 = (int)sVar44 < 2;
                        sVar44 = (stbi__gif_lzw)((int)sVar44 + -1);
                        if (bVar7) {
                          if ((int)g->codes[0xfbd] < 0x18) {
                            stbi__grow_buffer_unsafe((stbi__jpeg *)g);
                          }
                          if ((g->codes[0xfbe].prefix & 0xf8) != 0xd0) goto LAB_00114ce0;
                          g->codes[0xfbc].prefix = 0;
                          g->codes[0xfbc].first = '\0';
                          g->codes[0xfbc].suffix = '\0';
                          g->codes[0xfbd].prefix = 0;
                          g->codes[0xfbd].first = '\0';
                          g->codes[0xfbd].suffix = '\0';
                          g->codes[0xfbf].prefix = 0;
                          g->codes[0xfbf].first = '\0';
                          g->codes[0xfbf].suffix = '\0';
                          g->codes[0xf92].prefix = 0;
                          g->codes[0xf92].first = '\0';
                          g->codes[0xf92].suffix = '\0';
                          g->codes[0xf7a].prefix = 0;
                          g->codes[0xf7a].first = '\0';
                          g->codes[0xf7a].suffix = '\0';
                          g->codes[0xf62].prefix = 0;
                          g->codes[0xf62].first = '\0';
                          g->codes[0xf62].suffix = '\0';
                          *(uchar *)&g->codes[0xfbe].prefix = 0xff;
                          sVar44 = g->codes[0xfcc];
                          if (sVar44 == (stbi__gif_lzw)0x0) {
                            sVar44.prefix = -1;
                            sVar44.first = 0xff;
                            sVar44.suffix = '\x7f';
                          }
                          g->codes[0xfcd] = sVar44;
                          g->codes[0xfc5].prefix = 0;
                          g->codes[0xfc5].first = '\0';
                          g->codes[0xfc5].suffix = '\0';
                        }
                        iVar46 = iVar46 + 1;
                        sVar77 = g->codes[0xf58];
                      } while (iVar46 < (int)sVar77);
                      sVar39 = g->codes[0xf59];
                    }
                    bVar92 = true;
                    iVar38 = iVar38 + 1;
                  } while (iVar38 < (int)sVar39);
                }
              }
LAB_00114ce0:
              if (!bVar92) goto LAB_00115cac;
            }
            else if (sVar77 == (stbi__gif_lzw)0x1) {
              sVar39 = g->codes[0xfc8];
              lVar80 = (long)(int)sVar39;
              iVar38 = (int)g->codes[lVar80 * 0x18 + 0xf64] + 7 >> 3;
              if (0 < iVar38) {
                iVar46 = (int)g->codes[lVar80 * 0x18 + 0xf63] + 7 >> 3;
                local_48bc = 0;
                do {
                  if (0 < iVar46) {
                    iVar69 = 0;
                    do {
                      data_01 = (code *)(paVar1[lVar80].coeff +
                                        (paVar1[lVar80].coeff_w * local_48bc + iVar69) * 0x40);
                      uVar88 = (ulong)(int)g->codes[0xfc1];
                      if (uVar88 == 0) {
                        iVar64 = stbi__jpeg_decode_block_prog_dc
                                           ((stbi__jpeg *)g,(short *)data_01,
                                            (stbi__huffman *)
                                            (g->pal + (long)paVar1[lVar80].hd * 0x1a4 + -10),
                                            (int)sVar39);
                        if (iVar64 == 0) goto LAB_00115cac;
                      }
                      else {
                        lVar67 = (long)paVar1[lVar80].ha;
                        sVar77 = g->codes[0xfc5];
                        bVar35 = g->codes[0xfc4].prefix;
                        if (g->codes[0xfc3] == (stbi__gif_lzw)0x0) {
                          if (sVar77 == (stbi__gif_lzw)0x0) {
                            sVar78 = g->codes[0xfbd];
                            do {
                              if ((int)sVar78 < 0x10) {
                                stbi__grow_buffer_unsafe((stbi__jpeg *)g);
                              }
                              sVar40 = g->codes[0xfbc];
                              uVar83 = (ulong)((uint)sVar40 >> 0x17);
                              sVar3 = (&g->codes[lVar67 * 0x100 + 0xb56].prefix)[uVar83];
                              uVar74 = (uint)sVar3;
                              iVar64 = (int)uVar88;
                              if (sVar3 == 0) {
                                if ((int)g->codes[0xfbd] < 0x10) {
                                  stbi__grow_buffer_unsafe((stbi__jpeg *)g);
                                  sVar40 = g->codes[0xfbc];
                                  uVar83 = (ulong)((uint)sVar40 >> 0x17);
                                }
                                uVar88 = (ulong)*(byte *)((long)&g->codes[lVar67 * 0x1a4 + 0x486].
                                                                 prefix + uVar83);
                                if (uVar88 == 0xff) {
                                  lVar84 = 0;
                                  do {
                                    lVar85 = lVar84;
                                    lVar84 = lVar85 + 1;
                                  } while ((uint)g->codes[lVar67 * 0x1a4 + lVar85 + 0x611] <=
                                           (uint)sVar40 >> 0x10);
                                  sVar77 = g->codes[0xfbd];
                                  if (lVar84 == 8) goto LAB_001170b1;
                                  if ((int)sVar77 < (int)(lVar85 + 10)) goto LAB_001170bb;
                                  uVar88 = (ulong)(int)(((uint)sVar40 >>
                                                         (0x17U - (char)lVar84 & 0x1f) &
                                                        stbi__bmask[lVar85 + 10]) +
                                                       (int)g->codes[lVar67 * 0x1a4 + lVar85 + 0x623
                                                                    ]);
                                  bVar61 = *(byte *)((long)&g->codes[lVar67 * 0x1a4 + 0x5c6].prefix
                                                    + uVar88);
                                  if (((uint)sVar40 >> (-bVar61 & 0x1f) & stbi__bmask[bVar61]) !=
                                      (uint)(ushort)(&g->codes[lVar67 * 0x1a4 + 0x506].prefix)
                                                    [uVar88]) goto LAB_00117b60;
                                  sVar78 = (stbi__gif_lzw)(((int)sVar77 - (int)lVar84) + -9);
                                  g->codes[0xfbd] = sVar78;
                                  sVar40 = (stbi__gif_lzw)
                                           ((int)sVar40 << ((byte)(lVar85 + 10) & 0x1f));
                                  g->codes[0xfbc] = sVar40;
                                }
                                else {
                                  bVar61 = *(byte *)((long)&g->codes[lVar67 * 0x1a4 + 0x5c6].prefix
                                                    + uVar88);
                                  sVar78 = (stbi__gif_lzw)((int)g->codes[0xfbd] - (uint)bVar61);
                                  if ((int)g->codes[0xfbd] < (int)(uint)bVar61) goto LAB_001170bb;
                                  sVar40 = (stbi__gif_lzw)((int)sVar40 << (bVar61 & 0x1f));
                                  g->codes[0xfbc] = sVar40;
                                  g->codes[0xfbd] = sVar78;
                                }
                                bVar61 = *(byte *)((long)&g->codes[lVar67 * 0x1a4 + 0x586].prefix +
                                                  uVar88);
                                uVar74 = bVar61 & 0xf;
                                bVar29 = bVar61 >> 4;
                                uVar90 = (uint)bVar29;
                                if ((bVar61 & 0xf) == 0) {
                                  if (bVar61 < 0xf0) {
                                    sVar77 = (stbi__gif_lzw)(1 << bVar29);
                                    g->codes[0xfc5] = sVar77;
                                    if (0xf < bVar61) {
                                      if ((int)sVar78 < (int)uVar90) {
                                        stbi__grow_buffer_unsafe((stbi__jpeg *)g);
                                        sVar40 = g->codes[0xfbc];
                                        sVar78 = g->codes[0xfbd];
                                        sVar77 = g->codes[0xfc5];
                                        data_01 = (code *)g;
                                      }
                                      uVar79 = (int)sVar40 << bVar29 | (uint)sVar40 >> 0x20 - bVar29
                                      ;
                                      uVar74 = stbi__bmask[uVar90];
                                      g->codes[0xfbc] = (stbi__gif_lzw)(~uVar74 & uVar79);
                                      sVar77 = (stbi__gif_lzw)((int)sVar77 + (uVar79 & uVar74));
                                      g->codes[0xfbd] = (stbi__gif_lzw)((int)sVar78 - uVar90);
                                    }
                                    goto LAB_0011406f;
                                  }
                                  uVar90 = iVar64 + 0x10;
                                }
                                else {
                                  lVar84 = (long)iVar64 + (ulong)uVar90;
                                  bVar61 = ""[lVar84];
                                  if ((int)sVar78 < (int)uVar74) {
                                    stbi__grow_buffer_unsafe((stbi__jpeg *)g);
                                    sVar40 = g->codes[0xfbc];
                                    sVar78 = g->codes[0xfbd];
                                  }
                                  uVar41 = (int)sVar40 << (sbyte)uVar74 |
                                           (uint)sVar40 >> 0x20 - (sbyte)uVar74;
                                  uVar79 = *(uint *)((long)stbi__bmask + (ulong)(uVar74 * 4));
                                  g->codes[0xfbc] = (stbi__gif_lzw)(~uVar79 & uVar41);
                                  sVar78 = (stbi__gif_lzw)((int)sVar78 - uVar74);
                                  g->codes[0xfbd] = sVar78;
                                  iVar64 = 0;
                                  if (-1 < (int)sVar40) {
                                    iVar64 = *(int *)((long)stbi__jbias + (ulong)(uVar74 * 4));
                                  }
                                  uVar90 = (int)lVar84 + 1;
                                  *(short *)((long)&((stbi__gif *)
                                                    (((stbi__gif *)data_01)->pal + -0xc))->w +
                                            (ulong)bVar61 * 2) =
                                       (short)((uVar41 & uVar79) + iVar64 << (bVar35 & 0x1f));
                                }
                              }
                              else {
                                lVar84 = (long)iVar64 + (ulong)(uVar74 >> 4 & 0xf);
                                g->codes[0xfbc] =
                                     (stbi__gif_lzw)((int)sVar40 << (sbyte)(uVar74 & 0xf));
                                sVar78 = (stbi__gif_lzw)((int)g->codes[0xfbd] - (uVar74 & 0xf));
                                g->codes[0xfbd] = sVar78;
                                uVar90 = (int)lVar84 + 1;
                                *(short *)((long)&((stbi__gif *)(((stbi__gif *)data_01)->pal + -0xc)
                                                  )->w + (ulong)""[lVar84] * 2) =
                                     (short)((uVar74 >> 8) << (bVar35 & 0x1f));
                              }
                              uVar88 = (ulong)uVar90;
                            } while ((int)uVar90 <= (int)g->codes[0xfc2]);
                          }
                          else {
LAB_0011406f:
                            g->codes[0xfc5] = (stbi__gif_lzw)((int)sVar77 + -1);
                          }
                        }
                        else if (sVar77 == (stbi__gif_lzw)0x0) {
                          iVar64 = 0x10000 << (bVar35 & 0x1f);
                          sVar77 = g->codes[0xfbd];
                          do {
                            if ((int)sVar77 < 0x10) {
                              stbi__grow_buffer_unsafe((stbi__jpeg *)g);
                            }
                            sVar78 = g->codes[0xfbc];
                            uVar83 = (ulong)*(byte *)((long)&g->codes[lVar67 * 0x1a4 + 0x486].prefix
                                                     + (ulong)((uint)sVar78 >> 0x17));
                            if (uVar83 == 0xff) {
                              lVar84 = 0;
                              do {
                                lVar85 = lVar84;
                                lVar84 = lVar85 + 1;
                              } while ((uint)g->codes[lVar67 * 0x1a4 + lVar85 + 0x611] <=
                                       (uint)sVar78 >> 0x10);
                              sVar77 = g->codes[0xfbd];
                              if (lVar84 == 8) goto LAB_001170b1;
                              if ((int)sVar77 < (int)(lVar85 + 10)) goto LAB_001170bb;
                              uVar83 = (ulong)(int)(((uint)sVar78 >> (0x17U - (char)lVar84 & 0x1f) &
                                                    stbi__bmask[lVar85 + 10]) +
                                                   (int)g->codes[lVar67 * 0x1a4 + lVar85 + 0x623]);
                              bVar61 = *(byte *)((long)&g->codes[lVar67 * 0x1a4 + 0x5c6].prefix +
                                                uVar83);
                              if (((uint)sVar78 >> (-bVar61 & 0x1f) & stbi__bmask[bVar61]) !=
                                  (uint)(ushort)(&g->codes[lVar67 * 0x1a4 + 0x506].prefix)[uVar83])
                              {
LAB_00117b60:
                                __assert_fail("(((j->code_buffer) >> (32 - h->size[c])) & stbi__bmask[h->size[c]]) == h->code[c]"
                                              ,
                                              "/workspace/llm4binary/github/license_all_cmakelists_25/SpexGuy[P]StupidSHTricks/include/stb/stb_image.h"
                                              ,0x673,
                                              "int stbi__jpeg_huff_decode(stbi__jpeg *, stbi__huffman *)"
                                             );
                              }
                              sVar77 = (stbi__gif_lzw)(((int)sVar77 - (int)lVar84) + -9);
                              g->codes[0xfbd] = sVar77;
                              sVar78 = (stbi__gif_lzw)((int)sVar78 << ((byte)(lVar85 + 10) & 0x1f));
                              g->codes[0xfbc] = sVar78;
                            }
                            else {
                              bVar61 = *(byte *)((long)&g->codes[lVar67 * 0x1a4 + 0x5c6].prefix +
                                                uVar83);
                              sVar77 = (stbi__gif_lzw)((int)g->codes[0xfbd] - (uint)bVar61);
                              if ((int)g->codes[0xfbd] < (int)(uint)bVar61) goto LAB_001170bb;
                              sVar78 = (stbi__gif_lzw)((int)sVar78 << (bVar61 & 0x1f));
                              g->codes[0xfbc] = sVar78;
                              g->codes[0xfbd] = sVar77;
                            }
                            bVar61 = *(byte *)((long)&g->codes[lVar67 * 0x1a4 + 0x586].prefix +
                                              uVar83);
                            bVar29 = bVar61 >> 4;
                            uVar74 = (uint)bVar29;
                            uVar83 = (ulong)uVar74;
                            if ((bVar61 & 0xf) == 1) {
                              if ((int)sVar77 < 1) {
                                stbi__grow_buffer_unsafe((stbi__jpeg *)g);
                                sVar78 = g->codes[0xfbc];
                                sVar77 = g->codes[0xfbd];
                              }
                              sVar40 = (stbi__gif_lzw)((int)sVar78 * 2);
                              g->codes[0xfbc] = sVar40;
                              sVar77 = (stbi__gif_lzw)((int)sVar77 + -1);
                              uVar62 = (undefined2)
                                       (((int)~(uint)sVar78 >> 0x1f | 1U) << (bVar35 & 0x1f));
                              g->codes[0xfbd] = sVar77;
                            }
                            else {
                              if ((bVar61 & 0xf) != 0) goto LAB_001170bb;
                              if (bVar61 < 0xf0) {
                                sVar40 = (stbi__gif_lzw)~(-1 << bVar29);
                                g->codes[0xfc5] = sVar40;
                                uVar87 = 0x40;
                                if (0xf < bVar61) {
                                  if ((int)sVar77 < (int)uVar74) {
                                    stbi__grow_buffer_unsafe((stbi__jpeg *)g);
                                    sVar78 = g->codes[0xfbc];
                                    sVar77 = g->codes[0xfbd];
                                    sVar40 = g->codes[0xfc5];
                                  }
                                  uVar79 = (int)sVar78 << bVar29 | (uint)sVar78 >> 0x20 - bVar29;
                                  uVar90 = stbi__bmask[uVar83];
                                  sVar78 = (stbi__gif_lzw)(~uVar90 & uVar79);
                                  g->codes[0xfbc] = sVar78;
                                  sVar77 = (stbi__gif_lzw)((int)sVar77 - uVar74);
                                  g->codes[0xfbd] = sVar77;
                                  g->codes[0xfc5] = (stbi__gif_lzw)((uVar79 & uVar90) + (int)sVar40)
                                  ;
                                }
                              }
                              else {
                                uVar87 = 0xf;
                              }
                              uVar62 = 0;
                              uVar83 = uVar87;
                              sVar40 = sVar78;
                            }
                            sVar78 = g->codes[0xfc2];
                            uVar87 = (ulong)(uint)sVar78;
                            if ((int)uVar88 <= (int)sVar78) {
                              uVar75 = (long)(int)uVar88;
                              do {
                                sVar78 = SUB84(uVar87,0);
                                uVar87 = (ulong)""[uVar75];
                                if (*(short *)((long)&((stbi__gif *)
                                                      (((stbi__gif *)data_01)->pal + -0xc))->w +
                                              uVar87 * 2) == 0) {
                                  if ((int)uVar83 == 0) {
                                    uVar88 = (ulong)((int)uVar75 + 1);
                                    *(undefined2 *)
                                     ((long)&((stbi__gif *)(((stbi__gif *)data_01)->pal + -0xc))->w
                                     + uVar87 * 2) = uVar62;
                                    break;
                                  }
                                  uVar83 = (ulong)((int)uVar83 - 1);
                                }
                                else {
                                  if ((int)sVar77 < 1) {
                                    stbi__grow_buffer_unsafe((stbi__jpeg *)g);
                                    sVar40 = g->codes[0xfbc];
                                    sVar77 = g->codes[0xfbd];
                                  }
                                  sVar78 = (stbi__gif_lzw)((int)sVar40 * 2);
                                  g->codes[0xfbc] = sVar78;
                                  sVar77 = (stbi__gif_lzw)((int)sVar77 + -1);
                                  g->codes[0xfbd] = sVar77;
                                  bVar92 = (int)sVar40 < 0;
                                  sVar40 = sVar78;
                                  if ((bVar92) &&
                                     (sVar3 = *(short *)((long)&((stbi__gif *)
                                                                (((stbi__gif *)data_01)->pal + -0xc)
                                                                )->w + uVar87 * 2),
                                     (iVar64 >> 0x10 & (int)sVar3) == 0)) {
                                    sVar30 = (short)((uint)iVar64 >> 0x10);
                                    if (sVar3 < 1) {
                                      sVar30 = -sVar30;
                                    }
                                    *(short *)((long)&((stbi__gif *)
                                                      (((stbi__gif *)data_01)->pal + -0xc))->w +
                                              uVar87 * 2) = sVar3 + sVar30;
                                  }
                                }
                                uVar88 = uVar75 + 1;
                                sVar78 = g->codes[0xfc2];
                                uVar87 = (ulong)(int)sVar78;
                                bVar92 = (long)uVar75 < (long)uVar87;
                                uVar75 = uVar88;
                              } while (bVar92);
                            }
                          } while ((int)uVar88 <= (int)sVar78);
                        }
                        else {
                          g->codes[0xfc5] = (stbi__gif_lzw)((int)sVar77 + -1);
                          if ((int)g->codes[0xfc1] <= (int)g->codes[0xfc2]) {
                            uVar74 = (0x10000 << (bVar35 & 0x1f)) >> 0x10;
                            do {
                              uVar83 = (ulong)""[uVar88];
                              if (*(short *)((long)&((stbi__gif *)
                                                    (((stbi__gif *)data_01)->pal + -0xc))->w +
                                            uVar83 * 2) != 0) {
                                sVar77 = g->codes[0xfbd];
                                if ((int)sVar77 < 1) {
                                  stbi__grow_buffer_unsafe((stbi__jpeg *)g);
                                  sVar77 = g->codes[0xfbd];
                                }
                                sVar78 = g->codes[0xfbc];
                                g->codes[0xfbc] = (stbi__gif_lzw)((int)sVar78 * 2);
                                g->codes[0xfbd] = (stbi__gif_lzw)((int)sVar77 + -1);
                                if (((int)sVar78 < 0) &&
                                   (sVar3 = *(short *)((long)&((stbi__gif *)
                                                              (((stbi__gif *)data_01)->pal + -0xc))
                                                              ->w + uVar83 * 2),
                                   (uVar74 & (int)sVar3) == 0)) {
                                  uVar90 = -uVar74;
                                  if (0 < sVar3) {
                                    uVar90 = uVar74;
                                  }
                                  *(short *)((long)&((stbi__gif *)
                                                    (((stbi__gif *)data_01)->pal + -0xc))->w +
                                            uVar83 * 2) = (short)uVar90 + sVar3;
                                }
                              }
                              bVar92 = (long)uVar88 < (long)(int)g->codes[0xfc2];
                              uVar88 = uVar88 + 1;
                            } while (bVar92);
                          }
                        }
                      }
                      sVar77 = g->codes[0xfcd];
                      g->codes[0xfcd] = (stbi__gif_lzw)((int)sVar77 + -1);
                      if ((int)sVar77 < 2) {
                        if ((int)g->codes[0xfbd] < 0x18) {
                          stbi__grow_buffer_unsafe((stbi__jpeg *)g);
                        }
                        bVar35 = (byte)g->codes[0xfbe].prefix;
                        if ((bVar35 & 0xf8) != 0xd0) goto LAB_00114cef;
                        g->codes[0xfbc].prefix = 0;
                        g->codes[0xfbc].first = '\0';
                        g->codes[0xfbc].suffix = '\0';
                        g->codes[0xfbd].prefix = 0;
                        g->codes[0xfbd].first = '\0';
                        g->codes[0xfbd].suffix = '\0';
                        g->codes[0xfbf].prefix = 0;
                        g->codes[0xfbf].first = '\0';
                        g->codes[0xfbf].suffix = '\0';
                        g->codes[0xf92].prefix = 0;
                        g->codes[0xf92].first = '\0';
                        g->codes[0xf92].suffix = '\0';
                        g->codes[0xf7a].prefix = 0;
                        g->codes[0xf7a].first = '\0';
                        g->codes[0xf7a].suffix = '\0';
                        g->codes[0xf62].prefix = 0;
                        g->codes[0xf62].first = '\0';
                        g->codes[0xf62].suffix = '\0';
                        *(uchar *)&g->codes[0xfbe].prefix = 0xff;
                        sVar42 = g->codes[0xfcc];
                        if (sVar42 == (stbi__gif_lzw)0x0) {
                          sVar42.prefix = -1;
                          sVar42.first = 0xff;
                          sVar42.suffix = '\x7f';
                        }
                        g->codes[0xfcd] = sVar42;
                        g->codes[0xfc5].prefix = 0;
                        g->codes[0xfc5].first = '\0';
                        g->codes[0xfc5].suffix = '\0';
                      }
                      iVar69 = iVar69 + 1;
                    } while (iVar69 != iVar46);
                  }
                  local_48bc = local_48bc + 1;
                } while (local_48bc != iVar38);
              }
            }
            else {
              sVar39 = g->codes[0xf59];
              if (0 < (int)sVar39) {
                sVar77 = g->codes[0xf58];
                iVar38 = 0;
                do {
                  if (0 < (int)sVar77) {
                    iVar46 = 0;
                    do {
                      sVar39 = g->codes[0xfc7];
                      if (0 < (int)sVar39) {
                        lVar80 = 0;
                        do {
                          sVar77 = g->codes[lVar80 + 0xfc8];
                          data_01 = (code *)(long)(int)sVar77;
                          sVar78 = g->codes[(long)data_01 * 0x18 + 0xf5e];
                          if (0 < (int)sVar78) {
                            iVar69 = paVar1[(long)data_01].h;
                            iVar64 = 0;
                            do {
                              if (0 < iVar69) {
                                iVar73 = 0;
                                do {
                                  iVar69 = stbi__jpeg_decode_block_prog_dc
                                                     ((stbi__jpeg *)g,
                                                      paVar1[(long)data_01].coeff +
                                                      (iVar69 * iVar46 + iVar73 +
                                                      (paVar1[(long)data_01].v * iVar38 + iVar64) *
                                                      paVar1[(long)data_01].coeff_w) * 0x40,
                                                      (stbi__huffman *)
                                                      (g->pal + (long)paVar1[(long)data_01].hd *
                                                                0x1a4 + -10),(int)sVar77);
                                  if (iVar69 == 0) goto LAB_00115cac;
                                  iVar73 = iVar73 + 1;
                                  iVar69 = paVar1[(long)data_01].h;
                                } while (iVar73 < iVar69);
                                sVar78 = (stbi__gif_lzw)paVar1[(long)data_01].v;
                              }
                              iVar64 = iVar64 + 1;
                            } while (iVar64 < (int)sVar78);
                            sVar39 = g->codes[0xfc7];
                          }
                          lVar80 = lVar80 + 1;
                        } while (lVar80 < (int)sVar39);
                        sVar44 = g->codes[0xfcd];
                      }
                      g->codes[0xfcd] = (stbi__gif_lzw)((int)sVar44 + -1);
                      bVar92 = (int)sVar44 < 2;
                      sVar44 = (stbi__gif_lzw)((int)sVar44 + -1);
                      if (bVar92) {
                        if ((int)g->codes[0xfbd] < 0x18) {
                          stbi__grow_buffer_unsafe((stbi__jpeg *)g);
                        }
                        bVar35 = (byte)g->codes[0xfbe].prefix;
                        if ((bVar35 & 0xf8) != 0xd0) goto LAB_00114cef;
                        g->codes[0xfbc].prefix = 0;
                        g->codes[0xfbc].first = '\0';
                        g->codes[0xfbc].suffix = '\0';
                        g->codes[0xfbd].prefix = 0;
                        g->codes[0xfbd].first = '\0';
                        g->codes[0xfbd].suffix = '\0';
                        g->codes[0xfbf].prefix = 0;
                        g->codes[0xfbf].first = '\0';
                        g->codes[0xfbf].suffix = '\0';
                        g->codes[0xf92].prefix = 0;
                        g->codes[0xf92].first = '\0';
                        g->codes[0xf92].suffix = '\0';
                        g->codes[0xf7a].prefix = 0;
                        g->codes[0xf7a].first = '\0';
                        g->codes[0xf7a].suffix = '\0';
                        g->codes[0xf62].prefix = 0;
                        g->codes[0xf62].first = '\0';
                        g->codes[0xf62].suffix = '\0';
                        *(uchar *)&g->codes[0xfbe].prefix = 0xff;
                        sVar44 = g->codes[0xfcc];
                        if (sVar44 == (stbi__gif_lzw)0x0) {
                          sVar44.prefix = -1;
                          sVar44.first = 0xff;
                          sVar44.suffix = '\x7f';
                        }
                        g->codes[0xfcd] = sVar44;
                        g->codes[0xfc5].prefix = 0;
                        g->codes[0xfc5].first = '\0';
                        g->codes[0xfc5].suffix = '\0';
                      }
                      iVar46 = iVar46 + 1;
                      sVar77 = g->codes[0xf58];
                    } while (iVar46 < (int)sVar77);
                    sVar39 = g->codes[0xf59];
                  }
                  iVar38 = iVar38 + 1;
                } while (iVar38 < (int)sVar39);
              }
            }
            bVar35 = (byte)g->codes[0xfbe].prefix;
LAB_00114cef:
            if (bVar35 != 0xff) goto LAB_001139e3;
LAB_00114cf7:
            do {
              lVar80 = *(long *)g;
              if (*(long *)(lVar80 + 0x10) == 0) {
LAB_00114d1b:
                if (*(ulong *)(lVar80 + 0xc0) <= *(ulong *)(lVar80 + 0xb8)) goto LAB_001139e3;
              }
              else {
                iVar38 = (**(code **)(lVar80 + 0x20))(*(undefined8 *)(lVar80 + 0x28));
                if (iVar38 != 0) {
                  if (*(int *)(lVar80 + 0x30) != 0) goto LAB_00114d1b;
                  goto LAB_001139e3;
                }
              }
              lVar80 = *(long *)g;
              pcVar5 = *(char **)(lVar80 + 0xb8);
              if (pcVar5 < *(char **)(lVar80 + 0xc0)) {
                *(char **)(lVar80 + 0xb8) = pcVar5 + 1;
                cVar36 = *pcVar5;
              }
              else {
                if (*(int *)(lVar80 + 0x30) == 0) goto LAB_00114cf7;
                data_01 = (code *)(lVar80 + 0x38);
                iVar38 = (**(code **)(lVar80 + 0x10))
                                   (*(undefined8 *)(lVar80 + 0x28),data_01,
                                    *(undefined4 *)(lVar80 + 0x34));
                if (iVar38 == 0) {
                  *(undefined4 *)(lVar80 + 0x30) = 0;
                  lVar67 = lVar80 + 0x39;
                  *(undefined1 *)(lVar80 + 0x38) = 0;
                  cVar36 = '\0';
                }
                else {
                  lVar67 = (long)&((stbi__gif *)(((stbi__gif *)data_01)->pal + -0xc))->w +
                           (long)iVar38;
                  cVar36 = *(char *)&((stbi__gif *)data_01)->w;
                }
                *(long *)(lVar80 + 0xc0) = lVar67;
                *(long *)(lVar80 + 0xb8) = lVar80 + 0x39;
              }
            } while (cVar36 == '\0');
            if (cVar36 != -1) {
              stbi__g_failure_reason = "junk before marker";
              goto LAB_00115cac;
            }
            lVar80 = *(long *)g;
            puVar52 = *(uchar **)(lVar80 + 0xb8);
            if (puVar52 < *(uchar **)(lVar80 + 0xc0)) {
              *(uchar **)(lVar80 + 0xb8) = puVar52 + 1;
              uVar37 = *puVar52;
            }
            else if (*(int *)(lVar80 + 0x30) == 0) {
              uVar37 = '\0';
            }
            else {
              data_01 = (code *)(lVar80 + 0x38);
              iVar38 = (**(code **)(lVar80 + 0x10))
                                 (*(undefined8 *)(lVar80 + 0x28),data_01,
                                  *(undefined4 *)(lVar80 + 0x34));
              if (iVar38 == 0) {
                *(undefined4 *)(lVar80 + 0x30) = 0;
                lVar67 = lVar80 + 0x39;
                *(undefined1 *)(lVar80 + 0x38) = 0;
                uVar37 = '\0';
              }
              else {
                lVar67 = (long)&((stbi__gif *)(((stbi__gif *)data_01)->pal + -0xc))->w +
                         (long)iVar38;
                uVar37 = *(uchar *)&((stbi__gif *)data_01)->w;
              }
              *(long *)(lVar80 + 0xc0) = lVar67;
              *(long *)(lVar80 + 0xb8) = lVar80 + 0x39;
            }
            *(uchar *)&g->codes[0xfbe].prefix = uVar37;
LAB_001139e3:
            bVar35 = stbi__get_marker((stbi__jpeg *)g);
            goto LAB_001139be;
          }
        }
        else {
          if (*(int *)(lVar80 + 0x30) != 0) {
            data_01 = (code *)(lVar80 + 0x38);
            iVar46 = (**(code **)(lVar80 + 0x10))
                               (*(undefined8 *)(lVar80 + 0x28),data_01,
                                *(undefined4 *)(lVar80 + 0x34));
            if (iVar46 == 0) {
              *(undefined4 *)(lVar80 + 0x30) = 0;
              lVar67 = lVar80 + 0x39;
              *(undefined1 *)(lVar80 + 0x38) = 0;
              bVar35 = 0;
            }
            else {
              lVar67 = (long)&((stbi__gif *)(((stbi__gif *)data_01)->pal + -0xc))->w + (long)iVar46;
              bVar35 = *(byte *)&((stbi__gif *)data_01)->w;
            }
            *(long *)(lVar80 + 0xc0) = lVar67;
            *(long *)(lVar80 + 0xb8) = lVar80 + 0x39;
            goto LAB_00113a75;
          }
          g->codes[0xfc7].prefix = 0;
          g->codes[0xfc7].first = '\0';
          g->codes[0xfc7].suffix = '\0';
        }
        stbi__g_failure_reason = "bad SOS component count";
      }
LAB_00115cac:
      stbi__cleanup_jpeg((stbi__jpeg *)g);
    }
    else {
      stbi__g_failure_reason = "bad req_comp";
    }
LAB_00115cb9:
    data = (stbi__context *)0x0;
    goto LAB_00115cbb;
  }
  stbi__g_failure_reason = "no SOI";
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  iVar38 = stbi__check_png_header(s);
  psVar58 = s->img_buffer_original;
  psVar76 = s->img_buffer_original_end;
  s->img_buffer = psVar58;
  s->img_buffer_end = psVar76;
  if (iVar38 != 0) {
    if (4 < (uint)req_comp) {
      stbi__g_failure_reason = "bad req_comp";
      return (uchar *)0x0;
    }
    local_47b8._0_8_ = s;
    iVar38 = stbi__parse_png_file((stbi__png *)local_47b8,0,req_comp);
    uVar56 = local_47b8._0_8_;
    if (iVar38 == 0) {
      puVar52 = (uchar *)0x0;
    }
    else {
      puVar52 = stack0xffffffffffffb860;
      if (aiStack_479c[1] == 0x10) {
        uVar74 = *(stbi__uint32 *)(local_47b8._0_8_ + 4) * *(stbi__uint32 *)local_47b8._0_8_ *
                 *(int *)(local_47b8._0_8_ + 0xc);
        puVar52 = (uchar *)malloc((long)(int)uVar74);
        if (0 < (int)uVar74) {
          uVar88 = 0;
          do {
            puVar52[uVar88] = stack0xffffffffffffb860[uVar88 * 2 + 1];
            uVar88 = uVar88 + 1;
          } while (uVar74 != uVar88);
        }
        free(stack0xffffffffffffb860);
      }
      if ((req_comp != 0) && (*(int *)(uVar56 + 0xc) != req_comp)) {
        puVar52 = stbi__convert_format
                            (puVar52,*(int *)(uVar56 + 0xc),req_comp,*(stbi__uint32 *)uVar56,
                             *(stbi__uint32 *)(uVar56 + 4));
        *(int *)(uVar56 + 0xc) = req_comp;
        if (puVar52 == (uchar *)0x0) {
          return (uchar *)0x0;
        }
      }
      *x = *(stbi__uint32 *)uVar56;
      *y = *(stbi__uint32 *)(uVar56 + 4);
      if (comp != (int *)0x0) {
        *comp = *(int *)(uVar56 + 8);
      }
      register0x00000038 = (uchar *)0x0;
    }
    free(register0x00000038);
    free((void *)local_47b8._16_8_);
    free((void *)local_47b8._8_8_);
    return puVar52;
  }
  if (psVar58 < psVar76) {
    psVar59 = psVar58 + 1;
    s->img_buffer = psVar59;
    sVar34 = *psVar58;
LAB_00114fd7:
    if (sVar34 != 'B') goto LAB_00115161;
    if (psVar59 < psVar76) {
      s->img_buffer = psVar59 + 1;
      sVar34 = *psVar59;
    }
    else {
      if (s->read_from_callbacks == 0) goto LAB_00115161;
      psVar76 = s->buffer_start;
      iVar38 = (*(s->io).read)(s->io_user_data,(char *)psVar76,s->buflen);
      if (iVar38 == 0) {
        s->read_from_callbacks = 0;
        psVar58 = s->buffer_start + 1;
        s->buffer_start[0] = '\0';
        sVar34 = '\0';
      }
      else {
        psVar58 = psVar76 + iVar38;
        sVar34 = *psVar76;
      }
      s->img_buffer_end = psVar58;
      s->img_buffer = s->buffer_start + 1;
    }
    if (sVar34 != 'M') goto LAB_00115161;
    stbi__get16le(s);
    stbi__get16le(s);
    stbi__get16le(s);
    stbi__get16le(s);
    stbi__get16le(s);
    stbi__get16le(s);
    uVar74 = stbi__get16le(s);
    iVar38 = stbi__get16le(s);
    uVar74 = iVar38 << 0x10 | uVar74;
    if (((uVar74 < 0x39) && ((0x100010000001000U >> ((ulong)uVar74 & 0x3f) & 1) != 0)) ||
       (uVar74 == 0x6c)) {
      s->img_buffer = s->img_buffer_original;
      s->img_buffer_end = s->img_buffer_original_end;
LAB_001150d7:
      local_47d8.all_a = 0xff;
      pvVar53 = stbi__bmp_parse_header(s,&local_47d8);
      local_4870 = local_47d8.all_a;
      if (pvVar53 == (void *)0x0) {
        return (uchar *)0x0;
      }
      sVar4 = s->img_y;
      sVar81 = -sVar4;
      if (0 < (int)sVar4) {
        sVar81 = sVar4;
      }
      s->img_y = sVar81;
      if (local_47d8.hsz == 0xc) {
        if (local_47d8.bpp < 0x18) {
          uVar74 = (local_47d8.offset + -0x26) / 3;
        }
        else {
LAB_00115265:
          uVar74 = 0;
        }
      }
      else {
        if (0xf < local_47d8.bpp) goto LAB_00115265;
        uVar74 = (local_47d8.offset - local_47d8.hsz) + -0xe >> 2;
      }
      iVar38 = 4 - (uint)(local_47d8.ma == 0);
      s->img_n = iVar38;
      if (2 < req_comp) {
        iVar38 = req_comp;
      }
      puVar52 = (uchar *)malloc((ulong)(sVar81 * iVar38 * s->img_x));
      if (puVar52 == (uchar *)0x0) {
        stbi__g_failure_reason = "outofmem";
        return (uchar *)0x0;
      }
      if (local_47d8.bpp < 0x10) {
        if (0x100 < (int)uVar74 || uVar74 == 0) {
          free(puVar52);
          stbi__g_failure_reason = "invalid";
          return (uchar *)0x0;
        }
        if (0 < (int)uVar74) {
          psVar76 = s->buffer_start;
          psVar58 = s->buffer_start + 1;
          psVar59 = s->img_buffer;
          psVar60 = s->img_buffer_end;
          uVar88 = 0;
          do {
            if (psVar59 < psVar60) {
              s->img_buffer = psVar59 + 1;
              sVar34 = *psVar59;
              psVar59 = psVar59 + 1;
            }
            else if (s->read_from_callbacks == 0) {
              sVar34 = '\0';
            }
            else {
              iVar46 = (*(s->io).read)(s->io_user_data,(char *)psVar76,s->buflen);
              if (iVar46 == 0) {
                s->read_from_callbacks = 0;
                s->buffer_start[0] = '\0';
                sVar34 = '\0';
                psVar60 = psVar58;
              }
              else {
                sVar34 = *psVar76;
                psVar60 = psVar76 + iVar46;
              }
              s->img_buffer_end = psVar60;
              s->img_buffer = psVar58;
              psVar59 = psVar58;
            }
            local_47b8[uVar88 * 4 + 2] = sVar34;
            if (psVar59 < psVar60) {
              s->img_buffer = psVar59 + 1;
              sVar34 = *psVar59;
              psVar59 = psVar59 + 1;
            }
            else if (s->read_from_callbacks == 0) {
              sVar34 = '\0';
            }
            else {
              iVar46 = (*(s->io).read)(s->io_user_data,(char *)psVar76,s->buflen);
              if (iVar46 == 0) {
                s->read_from_callbacks = 0;
                s->buffer_start[0] = '\0';
                sVar34 = '\0';
                psVar60 = psVar58;
              }
              else {
                sVar34 = *psVar76;
                psVar60 = psVar76 + iVar46;
              }
              s->img_buffer_end = psVar60;
              s->img_buffer = psVar58;
              psVar59 = psVar58;
            }
            local_47b8[uVar88 * 4 + 1] = sVar34;
            if (psVar59 < psVar60) {
              s->img_buffer = psVar59 + 1;
              sVar34 = *psVar59;
              psVar59 = psVar59 + 1;
            }
            else if (s->read_from_callbacks == 0) {
              sVar34 = '\0';
            }
            else {
              iVar46 = (*(s->io).read)(s->io_user_data,(char *)psVar76,s->buflen);
              if (iVar46 == 0) {
                s->read_from_callbacks = 0;
                s->buffer_start[0] = '\0';
                sVar34 = '\0';
                psVar60 = psVar58;
              }
              else {
                sVar34 = *psVar76;
                psVar60 = psVar76 + iVar46;
              }
              s->img_buffer_end = psVar60;
              s->img_buffer = psVar58;
              psVar59 = psVar58;
            }
            local_47b8[uVar88 * 4] = sVar34;
            if (local_47d8.hsz != 0xc) {
              if (psVar59 < psVar60) {
                psVar59 = psVar59 + 1;
              }
              else {
                if (s->read_from_callbacks == 0) goto LAB_00115c24;
                iVar46 = (*(s->io).read)(s->io_user_data,(char *)psVar76,s->buflen);
                if (iVar46 == 0) {
                  s->read_from_callbacks = 0;
                  s->buffer_start[0] = '\0';
                  psVar60 = psVar58;
                }
                else {
                  psVar60 = psVar76 + iVar46;
                }
                s->img_buffer_end = psVar60;
                psVar59 = psVar58;
              }
              s->img_buffer = psVar59;
            }
LAB_00115c24:
            local_47b8[uVar88 * 4 + 3] = 0xff;
            uVar88 = uVar88 + 1;
          } while (uVar74 != uVar88);
        }
        stbi__skip(s,(uVar74 * (local_47d8.hsz == 0xc | 0xfffffffc) - local_47d8.hsz) +
                     local_47d8.offset + -0xe);
        if (local_47d8.bpp == 8) {
          uVar74 = s->img_x;
        }
        else {
          if (local_47d8.bpp != 4) {
            free(puVar52);
            stbi__g_failure_reason = "bad bpp";
            return (uchar *)0x0;
          }
          uVar74 = s->img_x + 1 >> 1;
        }
        sVar81 = s->img_y;
        if (0 < (int)sVar81) {
          local_48d8 = -uVar74 & 3;
          psVar76 = s->buffer_start;
          psVar58 = s->buffer_start + 1;
          uVar88 = 0;
          iVar46 = 0;
          do {
            if (0 < (int)s->img_x) {
              psVar59 = s->img_buffer;
              psVar60 = s->img_buffer_end;
              iVar69 = 0;
              do {
                if (psVar59 < psVar60) {
                  s->img_buffer = psVar59 + 1;
                  bVar35 = *psVar59;
                  psVar59 = psVar59 + 1;
                }
                else if (s->read_from_callbacks == 0) {
                  bVar35 = 0;
                }
                else {
                  iVar64 = (*(s->io).read)(s->io_user_data,(char *)psVar76,s->buflen);
                  if (iVar64 == 0) {
                    s->read_from_callbacks = 0;
                    s->buffer_start[0] = '\0';
                    bVar35 = 0;
                    psVar60 = psVar58;
                  }
                  else {
                    bVar35 = *psVar76;
                    psVar60 = psVar76 + iVar64;
                  }
                  s->img_buffer_end = psVar60;
                  s->img_buffer = psVar58;
                  psVar59 = psVar58;
                }
                uVar90 = bVar35 & 0xf;
                uVar74 = (uint)(bVar35 >> 4);
                if (local_47d8.bpp != 4) {
                  uVar74 = (uint)bVar35;
                }
                uVar83 = (ulong)uVar74;
                if (local_47d8.bpp != 4) {
                  uVar90 = 0;
                }
                lVar80 = (long)(int)uVar88;
                uVar87 = lVar80 + 3;
                puVar52[lVar80] = local_47b8[uVar83 * 4];
                puVar52[lVar80 + 1] = local_47b8[uVar83 * 4 + 1];
                puVar52[lVar80 + 2] = local_47b8[uVar83 * 4 + 2];
                if (iVar38 == 4) {
                  puVar52[lVar80 + 3] = 0xff;
                  uVar87 = (ulong)((int)uVar88 + 4);
                }
                if (iVar69 + 1U == s->img_x) {
                  uVar88 = uVar87 & 0xffffffff;
                  break;
                }
                if (local_47d8.bpp == 8) {
                  if (psVar59 < psVar60) {
                    s->img_buffer = psVar59 + 1;
                    bVar35 = *psVar59;
                    psVar59 = psVar59 + 1;
                  }
                  else if (s->read_from_callbacks == 0) {
                    bVar35 = 0;
                  }
                  else {
                    iVar64 = (*(s->io).read)(s->io_user_data,(char *)psVar76,s->buflen);
                    if (iVar64 == 0) {
                      s->read_from_callbacks = 0;
                      s->buffer_start[0] = '\0';
                      bVar35 = 0;
                      psVar60 = psVar58;
                    }
                    else {
                      bVar35 = *psVar76;
                      psVar60 = psVar76 + iVar64;
                    }
                    s->img_buffer_end = psVar60;
                    s->img_buffer = psVar58;
                    psVar59 = psVar58;
                  }
                  uVar90 = (uint)bVar35;
                }
                lVar80 = (long)(int)uVar87;
                uVar88 = lVar80 + 3;
                uVar83 = (ulong)uVar90;
                puVar52[lVar80] = local_47b8[uVar83 * 4];
                puVar52[lVar80 + 1] = local_47b8[uVar83 * 4 + 1];
                puVar52[lVar80 + 2] = local_47b8[uVar83 * 4 + 2];
                if (iVar38 == 4) {
                  puVar52[lVar80 + 3] = 0xff;
                  uVar88 = (ulong)((int)uVar87 + 4);
                }
                iVar69 = iVar69 + 2;
              } while (iVar69 < (int)s->img_x);
            }
            stbi__skip(s,local_48d8);
            iVar46 = iVar46 + 1;
            sVar81 = s->img_y;
          } while (iVar46 < (int)sVar81);
        }
        goto LAB_001167b9;
      }
      stbi__skip(s,(local_47d8.offset - local_47d8.hsz) + -0xe);
      if (local_47d8.bpp == 0x10) {
        uVar74 = s->img_x * 2 & 2;
        local_4844 = uVar74;
LAB_00115d90:
        auVar95._0_4_ = -(uint)(local_47d8.mg == 0);
        auVar95._4_4_ = -(uint)(local_47d8.mg == 0);
        auVar95._8_4_ = -(uint)(local_47d8.mr == 0);
        auVar95._12_4_ = -(uint)(local_47d8.mr == 0);
        iVar46 = movmskpd(uVar74,auVar95);
        if (local_47d8.mb == 0 || iVar46 != 0) {
          free(puVar52);
          stbi__g_failure_reason = "bad masks";
          return (uchar *)0x0;
        }
        iVar46 = stbi__high_bit(local_47d8.mb);
        iVar46 = iVar46 + -7;
        local_48a8 = CONCAT44(local_47d8.mb,local_47d8.mg) & 0x5555555555555555;
        iVar69 = stbi__high_bit(local_47d8.mg);
        iVar69 = iVar69 + -7;
        local_48bc = stbi__high_bit(local_47d8.mb);
        local_48bc = local_48bc + -7;
        local_4840 = stbi__high_bit(local_47d8.ma);
        local_4840 = local_4840 + -7;
        uVar74 = (local_47d8.mg >> 1 & 0x55555555) + (int)local_48a8;
        uVar90 = (local_47d8.mb >> 1 & 0x55555555) + local_48a8._4_4_;
        uVar79 = (local_47d8.mg >> 1 & 0x55555555) + (local_47d8.mg & 0x55555555);
        uVar41 = (local_47d8.mr >> 1 & 0x55555555) + (local_47d8.mr & 0x55555555);
        uVar74 = (uVar74 >> 2 & 0x33333333) + (uVar74 & 0x33333333);
        uVar90 = (uVar90 >> 2 & 0x33333333) + (uVar90 & 0x33333333);
        uVar79 = (uVar79 >> 2 & 0x33333333) + (uVar79 & 0x33333333);
        uVar41 = (uVar41 >> 2 & 0x33333333) + (uVar41 & 0x33333333);
        auVar96._0_4_ = (uVar74 >> 4) + uVar74;
        auVar96._4_4_ = (uVar90 >> 4) + uVar90;
        auVar96._8_4_ = (uVar79 >> 4) + uVar79;
        auVar96._12_4_ = (uVar41 >> 4) + uVar41;
        in_XMM1 = auVar96 & _DAT_0015d7c0;
        in_XMM2._0_4_ = (in_XMM1._0_4_ >> 8) + in_XMM1._0_4_;
        in_XMM2._4_4_ = (in_XMM1._4_4_ >> 8) + in_XMM1._4_4_;
        in_XMM2._8_4_ = (in_XMM1._8_4_ >> 8) + in_XMM1._8_4_;
        in_XMM2._12_4_ = (in_XMM1._12_4_ >> 8) + in_XMM1._12_4_;
        uVar74 = (in_XMM2._0_4_ >> 0x10) + in_XMM2._0_4_ & 0x3f;
        uVar90 = (in_XMM2._4_4_ >> 0x10) + in_XMM2._4_4_ & 0x3f;
        uVar79 = (in_XMM2._8_4_ >> 0x10) + in_XMM2._8_4_ & 0x3f;
        uVar41 = (in_XMM2._12_4_ >> 0x10) + in_XMM2._12_4_ & 0x3f;
        bVar7 = true;
        bVar92 = false;
      }
      else {
        if (local_47d8.bpp == 0x20) {
          auVar93._0_4_ = -(uint)(local_47d8.mg == 0xff000000);
          auVar93._4_4_ = -(uint)(local_47d8.mb == 0xff);
          auVar93._8_4_ = -(uint)(local_47d8.mg == 0xff00);
          auVar93._12_4_ = -(uint)(local_47d8.mr == 0xff0000);
          uVar74 = movmskps(extraout_EAX,auVar93);
          local_4844 = 0;
          uVar74 = uVar74 ^ 0xf;
          if (uVar74 != 0) goto LAB_00115d90;
          bVar92 = true;
        }
        else {
          local_4844 = 0;
          uVar74 = extraout_EAX;
          if (local_47d8.bpp != 0x18) goto LAB_00115d90;
          local_4844 = s->img_x & 3;
          bVar92 = false;
        }
        uVar74 = 0;
        uVar90 = 0;
        uVar79 = 0;
        uVar41 = 0;
        bVar7 = false;
        iVar46 = 0;
        iVar69 = 0;
        local_48bc = 0;
        local_4840 = 0;
      }
      sVar81 = s->img_y;
      if (0 < (int)sVar81) {
        psVar76 = s->buffer_start;
        psVar58 = s->buffer_start + 1;
        auVar97._0_4_ = -(uint)(-0x7ffffff9 < (int)(uVar74 ^ 0x80000000));
        auVar97._4_4_ = -(uint)(-0x7ffffff9 < (int)(uVar90 ^ 0x80000000));
        auVar97._8_4_ = -(uint)(-0x7ffffff9 < (int)(uVar79 ^ 0x80000000));
        auVar97._12_4_ = -(uint)(-0x7ffffff9 < (int)(uVar41 ^ 0x80000000));
        uVar47 = movmskps(-local_4840,auVar97);
        uVar47 = uVar47 ^ 0xf;
        in_XMM2._4_4_ = local_47d8.mb;
        in_XMM2._0_4_ = local_47d8.mg;
        in_XMM2._8_4_ = local_47d8.mg;
        in_XMM2._12_4_ = local_47d8.mr;
        in_XMM1._4_4_ = uVar90;
        in_XMM1._0_4_ = uVar90;
        in_XMM1._8_4_ = uVar90;
        in_XMM1._12_4_ = uVar90;
        iVar73 = 0;
        iVar64 = 0;
        do {
          if (bVar7) {
            if (0 < (int)s->img_x) {
              iVar45 = 0;
              do {
                uVar48 = stbi__get16le(s);
                if (local_47d8.bpp != 0x10) {
                  iVar135 = stbi__get16le(s);
                  uVar48 = uVar48 | iVar135 << 0x10;
                }
                iVar135 = (int)(uVar48 & local_47d8.mr) >> ((byte)iVar46 & 0x1f);
                if (iVar46 < 0) {
                  iVar135 = (uVar48 & local_47d8.mr) << (-(byte)iVar46 & 0x1f);
                }
                uVar65 = uVar41;
                iVar70 = iVar135;
                if ((byte)((byte)uVar47 >> 3) == 0) {
                  uVar37 = (uchar)iVar135;
                }
                else {
                  do {
                    iVar70 = iVar70 + (iVar135 >> ((byte)uVar65 & 0x1f));
                    uVar37 = (uchar)iVar70;
                    uVar65 = uVar65 + uVar41;
                  } while (uVar65 < 8);
                }
                puVar52[iVar73] = uVar37;
                iVar135 = (int)(uVar48 & local_47d8.mg) >> ((byte)iVar69 & 0x1f);
                if (iVar69 < 0) {
                  iVar135 = (uVar48 & local_47d8.mg) << (-(byte)iVar69 & 0x1f);
                }
                uVar65 = uVar79;
                iVar70 = iVar135;
                if ((uVar47 & 4) == 0) {
                  uVar37 = (uchar)iVar135;
                }
                else {
                  do {
                    iVar70 = iVar70 + (iVar135 >> ((byte)uVar65 & 0x1f));
                    uVar37 = (uchar)iVar70;
                    uVar65 = uVar65 + uVar79;
                  } while (uVar65 < 8);
                }
                puVar52[(long)iVar73 + 1] = uVar37;
                iVar135 = (int)(uVar48 & local_47d8.mb) >> ((byte)local_48bc & 0x1f);
                if (local_48bc < 0) {
                  iVar135 = (uVar48 & local_47d8.mb) << (-(byte)local_48bc & 0x1f);
                }
                uVar65 = uVar90;
                iVar70 = iVar135;
                if ((uVar47 & 2) == 0) {
                  uVar37 = (uchar)iVar135;
                }
                else {
                  do {
                    iVar70 = iVar70 + (iVar135 >> ((byte)uVar65 & 0x1f));
                    uVar37 = (uchar)iVar70;
                    uVar65 = uVar65 + uVar90;
                  } while (uVar65 < 8);
                }
                puVar52[(long)iVar73 + 2] = uVar37;
                if (local_47d8.ma == 0) {
                  uVar48 = 0xff;
                }
                else {
                  uVar65 = (int)(uVar48 & local_47d8.ma) >> ((byte)local_4840 & 0x1f);
                  if (local_4840 < 0) {
                    uVar65 = (uVar48 & local_47d8.ma) << ((byte)-local_4840 & 0x1f);
                  }
                  uVar48 = uVar65;
                  uVar66 = uVar74;
                  if ((uVar47 & 1) != 0) {
                    do {
                      uVar48 = uVar48 + ((int)uVar65 >> ((byte)uVar66 & 0x1f));
                      uVar66 = uVar66 + uVar74;
                    } while (uVar66 < 8);
                  }
                }
                iVar135 = iVar73 + 3;
                if (iVar38 == 4) {
                  puVar52[(long)iVar73 + 3] = (uchar)uVar48;
                  iVar135 = iVar73 + 4;
                }
                iVar73 = iVar135;
                local_4870 = local_4870 | uVar48;
                iVar45 = iVar45 + 1;
              } while (iVar45 < (int)s->img_x);
            }
          }
          else if (0 < (int)s->img_x) {
            psVar59 = s->img_buffer;
            psVar60 = s->img_buffer_end;
            iVar45 = 0;
            do {
              if (psVar59 < psVar60) {
                s->img_buffer = psVar59 + 1;
                bVar35 = *psVar59;
                psVar59 = psVar59 + 1;
              }
              else if (s->read_from_callbacks == 0) {
                bVar35 = 0;
              }
              else {
                iVar135 = (*(s->io).read)(s->io_user_data,(char *)psVar76,s->buflen);
                if (iVar135 == 0) {
                  s->read_from_callbacks = 0;
                  s->buffer_start[0] = '\0';
                  bVar35 = 0;
                  psVar60 = psVar58;
                }
                else {
                  bVar35 = *psVar76;
                  psVar60 = psVar76 + iVar135;
                }
                s->img_buffer_end = psVar60;
                s->img_buffer = psVar58;
                psVar59 = psVar58;
              }
              puVar52[(long)iVar73 + 2] = bVar35;
              if (psVar59 < psVar60) {
                s->img_buffer = psVar59 + 1;
                bVar35 = *psVar59;
                psVar59 = psVar59 + 1;
              }
              else if (s->read_from_callbacks == 0) {
                bVar35 = 0;
              }
              else {
                iVar135 = (*(s->io).read)(s->io_user_data,(char *)psVar76,s->buflen);
                if (iVar135 == 0) {
                  s->read_from_callbacks = 0;
                  s->buffer_start[0] = '\0';
                  bVar35 = 0;
                  psVar60 = psVar58;
                }
                else {
                  bVar35 = *psVar76;
                  psVar60 = psVar76 + iVar135;
                }
                s->img_buffer_end = psVar60;
                s->img_buffer = psVar58;
                psVar59 = psVar58;
              }
              puVar52[(long)iVar73 + 1] = bVar35;
              if (psVar59 < psVar60) {
                s->img_buffer = psVar59 + 1;
                bVar35 = *psVar59;
                psVar59 = psVar59 + 1;
              }
              else if (s->read_from_callbacks == 0) {
                bVar35 = 0;
              }
              else {
                iVar135 = (*(s->io).read)(s->io_user_data,(char *)psVar76,s->buflen);
                if (iVar135 == 0) {
                  s->read_from_callbacks = 0;
                  s->buffer_start[0] = '\0';
                  bVar35 = 0;
                  psVar60 = psVar58;
                }
                else {
                  bVar35 = *psVar76;
                  psVar60 = psVar76 + iVar135;
                }
                s->img_buffer_end = psVar60;
                s->img_buffer = psVar58;
                psVar59 = psVar58;
              }
              puVar52[iVar73] = bVar35;
              bVar35 = 0xff;
              if (bVar92) {
                if (psVar59 < psVar60) {
                  s->img_buffer = psVar59 + 1;
                  bVar35 = *psVar59;
                  psVar59 = psVar59 + 1;
                }
                else if (s->read_from_callbacks == 0) {
                  bVar35 = 0;
                }
                else {
                  iVar135 = (*(s->io).read)(s->io_user_data,(char *)psVar76,s->buflen);
                  if (iVar135 == 0) {
                    s->read_from_callbacks = 0;
                    s->buffer_start[0] = '\0';
                    bVar35 = 0;
                    psVar60 = psVar58;
                  }
                  else {
                    bVar35 = *psVar76;
                    psVar60 = psVar76 + iVar135;
                  }
                  s->img_buffer_end = psVar60;
                  s->img_buffer = psVar58;
                  psVar59 = psVar58;
                }
              }
              iVar135 = iVar73 + 3;
              if (iVar38 == 4) {
                puVar52[(long)iVar73 + 3] = bVar35;
                iVar135 = iVar73 + 4;
              }
              iVar73 = iVar135;
              local_4870 = local_4870 | bVar35;
              iVar45 = iVar45 + 1;
            } while (iVar45 < (int)s->img_x);
          }
          stbi__skip(s,local_4844);
          iVar64 = iVar64 + 1;
          sVar81 = s->img_y;
        } while (iVar64 < (int)sVar81);
      }
LAB_001167b9:
      auVar33 = _DAT_0015d860;
      auVar32 = _DAT_0015d850;
      auVar31 = _DAT_0015d840;
      auVar97 = _DAT_0015d830;
      auVar96 = _DAT_0015d820;
      auVar95 = _DAT_0015d810;
      auVar93 = _DAT_0015d040;
      if (((iVar38 == 4) && (local_4870 == 0)) &&
         (uVar74 = s->img_x * sVar81 * 4 - 1, -1 < (int)uVar74)) {
        uVar90 = uVar74 >> 2;
        auVar94._4_4_ = 0;
        auVar94._0_4_ = uVar90;
        auVar94._8_4_ = uVar90;
        auVar94._12_4_ = 0;
        puVar57 = puVar52 + uVar74;
        uVar88 = 0;
        do {
          auVar115._8_4_ = (int)uVar88;
          auVar115._0_8_ = uVar88;
          auVar115._12_4_ = (int)(uVar88 >> 0x20);
          auVar117 = auVar94 | auVar93;
          auVar119 = (auVar115 | auVar33) ^ auVar93;
          iVar46 = auVar117._0_4_;
          iVar45 = -(uint)(iVar46 < auVar119._0_4_);
          iVar69 = auVar117._4_4_;
          auVar121._4_4_ = -(uint)(iVar69 < auVar119._4_4_);
          iVar64 = auVar117._8_4_;
          iVar135 = -(uint)(iVar64 < auVar119._8_4_);
          iVar73 = auVar117._12_4_;
          auVar121._12_4_ = -(uint)(iVar73 < auVar119._12_4_);
          auVar98._4_4_ = iVar45;
          auVar98._0_4_ = iVar45;
          auVar98._8_4_ = iVar135;
          auVar98._12_4_ = iVar135;
          auVar98 = pshuflw(in_XMM1,auVar98,0xe8);
          auVar120._4_4_ = -(uint)(auVar119._4_4_ == iVar69);
          auVar120._12_4_ = -(uint)(auVar119._12_4_ == iVar73);
          auVar120._0_4_ = auVar120._4_4_;
          auVar120._8_4_ = auVar120._12_4_;
          auVar107 = pshuflw(in_XMM2,auVar120,0xe8);
          auVar121._0_4_ = auVar121._4_4_;
          auVar121._8_4_ = auVar121._12_4_;
          auVar119 = pshuflw(auVar98,auVar121,0xe8);
          auVar117._8_4_ = 0xffffffff;
          auVar117._0_8_ = 0xffffffffffffffff;
          auVar117._12_4_ = 0xffffffff;
          auVar117 = (auVar119 | auVar107 & auVar98) ^ auVar117;
          auVar117 = packssdw(auVar117,auVar117);
          if ((auVar117 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            *puVar57 = 0xff;
          }
          auVar107._4_4_ = iVar45;
          auVar107._0_4_ = iVar45;
          auVar107._8_4_ = iVar135;
          auVar107._12_4_ = iVar135;
          auVar121 = auVar120 & auVar107 | auVar121;
          auVar117 = packssdw(auVar121,auVar121);
          auVar119._8_4_ = 0xffffffff;
          auVar119._0_8_ = 0xffffffffffffffff;
          auVar119._12_4_ = 0xffffffff;
          auVar117 = packssdw(auVar117 ^ auVar119,auVar117 ^ auVar119);
          auVar117 = packsswb(auVar117,auVar117);
          if ((auVar117._0_4_ >> 8 & 1) != 0) {
            puVar57[-4] = 0xff;
          }
          auVar117 = (auVar115 | auVar32) ^ auVar93;
          auVar108._0_4_ = -(uint)(iVar46 < auVar117._0_4_);
          auVar108._4_4_ = -(uint)(iVar69 < auVar117._4_4_);
          auVar108._8_4_ = -(uint)(iVar64 < auVar117._8_4_);
          auVar108._12_4_ = -(uint)(iVar73 < auVar117._12_4_);
          auVar122._4_4_ = auVar108._0_4_;
          auVar122._0_4_ = auVar108._0_4_;
          auVar122._8_4_ = auVar108._8_4_;
          auVar122._12_4_ = auVar108._8_4_;
          iVar45 = -(uint)(auVar117._4_4_ == iVar69);
          iVar135 = -(uint)(auVar117._12_4_ == iVar73);
          auVar17._4_4_ = iVar45;
          auVar17._0_4_ = iVar45;
          auVar17._8_4_ = iVar135;
          auVar17._12_4_ = iVar135;
          auVar132._4_4_ = auVar108._4_4_;
          auVar132._0_4_ = auVar108._4_4_;
          auVar132._8_4_ = auVar108._12_4_;
          auVar132._12_4_ = auVar108._12_4_;
          auVar117 = auVar17 & auVar122 | auVar132;
          auVar117 = packssdw(auVar117,auVar117);
          auVar8._8_4_ = 0xffffffff;
          auVar8._0_8_ = 0xffffffffffffffff;
          auVar8._12_4_ = 0xffffffff;
          auVar117 = packssdw(auVar117 ^ auVar8,auVar117 ^ auVar8);
          auVar117 = packsswb(auVar117,auVar117);
          if ((auVar117._0_4_ >> 0x10 & 1) != 0) {
            puVar57[-8] = 0xff;
          }
          auVar117 = pshufhw(auVar117,auVar122,0x84);
          auVar18._4_4_ = iVar45;
          auVar18._0_4_ = iVar45;
          auVar18._8_4_ = iVar135;
          auVar18._12_4_ = iVar135;
          auVar119 = pshufhw(auVar108,auVar18,0x84);
          auVar98 = pshufhw(auVar117,auVar132,0x84);
          auVar99._8_4_ = 0xffffffff;
          auVar99._0_8_ = 0xffffffffffffffff;
          auVar99._12_4_ = 0xffffffff;
          auVar99 = (auVar98 | auVar119 & auVar117) ^ auVar99;
          auVar117 = packssdw(auVar99,auVar99);
          auVar117 = packsswb(auVar117,auVar117);
          if ((auVar117._0_4_ >> 0x18 & 1) != 0) {
            puVar57[-0xc] = 0xff;
          }
          auVar117 = (auVar115 | auVar31) ^ auVar93;
          auVar109._0_4_ = -(uint)(iVar46 < auVar117._0_4_);
          auVar109._4_4_ = -(uint)(iVar69 < auVar117._4_4_);
          auVar109._8_4_ = -(uint)(iVar64 < auVar117._8_4_);
          auVar109._12_4_ = -(uint)(iVar73 < auVar117._12_4_);
          auVar19._4_4_ = auVar109._0_4_;
          auVar19._0_4_ = auVar109._0_4_;
          auVar19._8_4_ = auVar109._8_4_;
          auVar19._12_4_ = auVar109._8_4_;
          auVar119 = pshuflw(auVar132,auVar19,0xe8);
          auVar100._0_4_ = -(uint)(auVar117._0_4_ == iVar46);
          auVar100._4_4_ = -(uint)(auVar117._4_4_ == iVar69);
          auVar100._8_4_ = -(uint)(auVar117._8_4_ == iVar64);
          auVar100._12_4_ = -(uint)(auVar117._12_4_ == iVar73);
          auVar123._4_4_ = auVar100._4_4_;
          auVar123._0_4_ = auVar100._4_4_;
          auVar123._8_4_ = auVar100._12_4_;
          auVar123._12_4_ = auVar100._12_4_;
          auVar117 = pshuflw(auVar100,auVar123,0xe8);
          auVar124._4_4_ = auVar109._4_4_;
          auVar124._0_4_ = auVar109._4_4_;
          auVar124._8_4_ = auVar109._12_4_;
          auVar124._12_4_ = auVar109._12_4_;
          auVar98 = pshuflw(auVar109,auVar124,0xe8);
          auVar9._8_4_ = 0xffffffff;
          auVar9._0_8_ = 0xffffffffffffffff;
          auVar9._12_4_ = 0xffffffff;
          auVar117 = packssdw(auVar117 & auVar119,(auVar98 | auVar117 & auVar119) ^ auVar9);
          auVar117 = packsswb(auVar117,auVar117);
          if ((auVar117 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            puVar57[-0x10] = 0xff;
          }
          auVar20._4_4_ = auVar109._0_4_;
          auVar20._0_4_ = auVar109._0_4_;
          auVar20._8_4_ = auVar109._8_4_;
          auVar20._12_4_ = auVar109._8_4_;
          auVar124 = auVar123 & auVar20 | auVar124;
          auVar98 = packssdw(auVar124,auVar124);
          auVar10._8_4_ = 0xffffffff;
          auVar10._0_8_ = 0xffffffffffffffff;
          auVar10._12_4_ = 0xffffffff;
          auVar117 = packssdw(auVar117,auVar98 ^ auVar10);
          auVar117 = packsswb(auVar117,auVar117);
          if ((auVar117._4_2_ >> 8 & 1) != 0) {
            puVar57[-0x14] = 0xff;
          }
          auVar117 = (auVar115 | auVar97) ^ auVar93;
          auVar110._0_4_ = -(uint)(iVar46 < auVar117._0_4_);
          auVar110._4_4_ = -(uint)(iVar69 < auVar117._4_4_);
          auVar110._8_4_ = -(uint)(iVar64 < auVar117._8_4_);
          auVar110._12_4_ = -(uint)(iVar73 < auVar117._12_4_);
          auVar125._4_4_ = auVar110._0_4_;
          auVar125._0_4_ = auVar110._0_4_;
          auVar125._8_4_ = auVar110._8_4_;
          auVar125._12_4_ = auVar110._8_4_;
          iVar45 = -(uint)(auVar117._4_4_ == iVar69);
          iVar135 = -(uint)(auVar117._12_4_ == iVar73);
          auVar21._4_4_ = iVar45;
          auVar21._0_4_ = iVar45;
          auVar21._8_4_ = iVar135;
          auVar21._12_4_ = iVar135;
          auVar133._4_4_ = auVar110._4_4_;
          auVar133._0_4_ = auVar110._4_4_;
          auVar133._8_4_ = auVar110._12_4_;
          auVar133._12_4_ = auVar110._12_4_;
          auVar117 = auVar21 & auVar125 | auVar133;
          auVar117 = packssdw(auVar117,auVar117);
          auVar11._8_4_ = 0xffffffff;
          auVar11._0_8_ = 0xffffffffffffffff;
          auVar11._12_4_ = 0xffffffff;
          auVar117 = packssdw(auVar117 ^ auVar11,auVar117 ^ auVar11);
          auVar117 = packsswb(auVar117,auVar117);
          if ((auVar117 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            puVar57[-0x18] = 0xff;
          }
          auVar117 = pshufhw(auVar117,auVar125,0x84);
          auVar22._4_4_ = iVar45;
          auVar22._0_4_ = iVar45;
          auVar22._8_4_ = iVar135;
          auVar22._12_4_ = iVar135;
          auVar119 = pshufhw(auVar110,auVar22,0x84);
          auVar98 = pshufhw(auVar117,auVar133,0x84);
          auVar101._8_4_ = 0xffffffff;
          auVar101._0_8_ = 0xffffffffffffffff;
          auVar101._12_4_ = 0xffffffff;
          auVar101 = (auVar98 | auVar119 & auVar117) ^ auVar101;
          auVar117 = packssdw(auVar101,auVar101);
          auVar117 = packsswb(auVar117,auVar117);
          if ((auVar117._6_2_ >> 8 & 1) != 0) {
            puVar57[-0x1c] = 0xff;
          }
          auVar117 = (auVar115 | auVar96) ^ auVar93;
          auVar111._0_4_ = -(uint)(iVar46 < auVar117._0_4_);
          auVar111._4_4_ = -(uint)(iVar69 < auVar117._4_4_);
          auVar111._8_4_ = -(uint)(iVar64 < auVar117._8_4_);
          auVar111._12_4_ = -(uint)(iVar73 < auVar117._12_4_);
          auVar23._4_4_ = auVar111._0_4_;
          auVar23._0_4_ = auVar111._0_4_;
          auVar23._8_4_ = auVar111._8_4_;
          auVar23._12_4_ = auVar111._8_4_;
          auVar119 = pshuflw(auVar133,auVar23,0xe8);
          auVar102._0_4_ = -(uint)(auVar117._0_4_ == iVar46);
          auVar102._4_4_ = -(uint)(auVar117._4_4_ == iVar69);
          auVar102._8_4_ = -(uint)(auVar117._8_4_ == iVar64);
          auVar102._12_4_ = -(uint)(auVar117._12_4_ == iVar73);
          auVar126._4_4_ = auVar102._4_4_;
          auVar126._0_4_ = auVar102._4_4_;
          auVar126._8_4_ = auVar102._12_4_;
          auVar126._12_4_ = auVar102._12_4_;
          auVar117 = pshuflw(auVar102,auVar126,0xe8);
          auVar127._4_4_ = auVar111._4_4_;
          auVar127._0_4_ = auVar111._4_4_;
          auVar127._8_4_ = auVar111._12_4_;
          auVar127._12_4_ = auVar111._12_4_;
          auVar98 = pshuflw(auVar111,auVar127,0xe8);
          auVar112._8_4_ = 0xffffffff;
          auVar112._0_8_ = 0xffffffffffffffff;
          auVar112._12_4_ = 0xffffffff;
          auVar112 = (auVar98 | auVar117 & auVar119) ^ auVar112;
          auVar98 = packssdw(auVar112,auVar112);
          auVar117 = packsswb(auVar117 & auVar119,auVar98);
          if ((auVar117 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            puVar57[-0x20] = 0xff;
          }
          auVar24._4_4_ = auVar111._0_4_;
          auVar24._0_4_ = auVar111._0_4_;
          auVar24._8_4_ = auVar111._8_4_;
          auVar24._12_4_ = auVar111._8_4_;
          auVar127 = auVar126 & auVar24 | auVar127;
          auVar98 = packssdw(auVar127,auVar127);
          auVar12._8_4_ = 0xffffffff;
          auVar12._0_8_ = 0xffffffffffffffff;
          auVar12._12_4_ = 0xffffffff;
          auVar98 = packssdw(auVar98 ^ auVar12,auVar98 ^ auVar12);
          auVar117 = packsswb(auVar117,auVar98);
          if ((auVar117._8_2_ >> 8 & 1) != 0) {
            puVar57[-0x24] = 0xff;
          }
          auVar117 = (auVar115 | auVar95) ^ auVar93;
          auVar113._0_4_ = -(uint)(iVar46 < auVar117._0_4_);
          auVar113._4_4_ = -(uint)(iVar69 < auVar117._4_4_);
          auVar113._8_4_ = -(uint)(iVar64 < auVar117._8_4_);
          auVar113._12_4_ = -(uint)(iVar73 < auVar117._12_4_);
          auVar128._4_4_ = auVar113._0_4_;
          auVar128._0_4_ = auVar113._0_4_;
          auVar128._8_4_ = auVar113._8_4_;
          auVar128._12_4_ = auVar113._8_4_;
          iVar45 = -(uint)(auVar117._4_4_ == iVar69);
          iVar135 = -(uint)(auVar117._12_4_ == iVar73);
          auVar25._4_4_ = iVar45;
          auVar25._0_4_ = iVar45;
          auVar25._8_4_ = iVar135;
          auVar25._12_4_ = iVar135;
          auVar134._4_4_ = auVar113._4_4_;
          auVar134._0_4_ = auVar113._4_4_;
          auVar134._8_4_ = auVar113._12_4_;
          auVar134._12_4_ = auVar113._12_4_;
          auVar117 = auVar25 & auVar128 | auVar134;
          auVar117 = packssdw(auVar117,auVar117);
          auVar13._8_4_ = 0xffffffff;
          auVar13._0_8_ = 0xffffffffffffffff;
          auVar13._12_4_ = 0xffffffff;
          auVar117 = packssdw(auVar117 ^ auVar13,auVar117 ^ auVar13);
          auVar117 = packsswb(auVar117,auVar117);
          if ((auVar117 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
            puVar57[-0x28] = 0xff;
          }
          auVar117 = pshufhw(auVar117,auVar128,0x84);
          auVar26._4_4_ = iVar45;
          auVar26._0_4_ = iVar45;
          auVar26._8_4_ = iVar135;
          auVar26._12_4_ = iVar135;
          auVar119 = pshufhw(auVar113,auVar26,0x84);
          auVar98 = pshufhw(auVar117,auVar134,0x84);
          auVar103._8_4_ = 0xffffffff;
          auVar103._0_8_ = 0xffffffffffffffff;
          auVar103._12_4_ = 0xffffffff;
          auVar103 = (auVar98 | auVar119 & auVar117) ^ auVar103;
          auVar117 = packssdw(auVar103,auVar103);
          auVar117 = packsswb(auVar117,auVar117);
          if ((auVar117._10_2_ >> 8 & 1) != 0) {
            puVar57[-0x2c] = 0xff;
          }
          auVar117 = (auVar115 | _DAT_0015d800) ^ auVar93;
          auVar114._0_4_ = -(uint)(iVar46 < auVar117._0_4_);
          auVar114._4_4_ = -(uint)(iVar69 < auVar117._4_4_);
          auVar114._8_4_ = -(uint)(iVar64 < auVar117._8_4_);
          auVar114._12_4_ = -(uint)(iVar73 < auVar117._12_4_);
          auVar27._4_4_ = auVar114._0_4_;
          auVar27._0_4_ = auVar114._0_4_;
          auVar27._8_4_ = auVar114._8_4_;
          auVar27._12_4_ = auVar114._8_4_;
          auVar119 = pshuflw(auVar134,auVar27,0xe8);
          auVar104._0_4_ = -(uint)(auVar117._0_4_ == iVar46);
          auVar104._4_4_ = -(uint)(auVar117._4_4_ == iVar69);
          auVar104._8_4_ = -(uint)(auVar117._8_4_ == iVar64);
          auVar104._12_4_ = -(uint)(auVar117._12_4_ == iVar73);
          auVar129._4_4_ = auVar104._4_4_;
          auVar129._0_4_ = auVar104._4_4_;
          auVar129._8_4_ = auVar104._12_4_;
          auVar129._12_4_ = auVar104._12_4_;
          auVar117 = pshuflw(auVar104,auVar129,0xe8);
          auVar130._4_4_ = auVar114._4_4_;
          auVar130._0_4_ = auVar114._4_4_;
          auVar130._8_4_ = auVar114._12_4_;
          auVar130._12_4_ = auVar114._12_4_;
          auVar98 = pshuflw(auVar114,auVar130,0xe8);
          auVar14._8_4_ = 0xffffffff;
          auVar14._0_8_ = 0xffffffffffffffff;
          auVar14._12_4_ = 0xffffffff;
          auVar117 = packssdw(auVar117 & auVar119,(auVar98 | auVar117 & auVar119) ^ auVar14);
          auVar117 = packsswb(auVar117,auVar117);
          if ((auVar117 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            puVar57[-0x30] = 0xff;
          }
          auVar28._4_4_ = auVar114._0_4_;
          auVar28._0_4_ = auVar114._0_4_;
          auVar28._8_4_ = auVar114._8_4_;
          auVar28._12_4_ = auVar114._8_4_;
          auVar130 = auVar129 & auVar28 | auVar130;
          auVar98 = packssdw(auVar130,auVar130);
          auVar15._8_4_ = 0xffffffff;
          auVar15._0_8_ = 0xffffffffffffffff;
          auVar15._12_4_ = 0xffffffff;
          auVar117 = packssdw(auVar117,auVar98 ^ auVar15);
          auVar117 = packsswb(auVar117,auVar117);
          if ((auVar117._12_2_ >> 8 & 1) != 0) {
            puVar57[-0x34] = 0xff;
          }
          auVar117 = (auVar115 | _DAT_0015d7f0) ^ auVar93;
          auVar105._0_4_ = -(uint)(iVar46 < auVar117._0_4_);
          auVar105._4_4_ = -(uint)(iVar69 < auVar117._4_4_);
          auVar105._8_4_ = -(uint)(iVar64 < auVar117._8_4_);
          auVar105._12_4_ = -(uint)(iVar73 < auVar117._12_4_);
          auVar131._4_4_ = auVar105._0_4_;
          auVar131._0_4_ = auVar105._0_4_;
          auVar131._8_4_ = auVar105._8_4_;
          auVar131._12_4_ = auVar105._8_4_;
          auVar116._4_4_ = -(uint)(auVar117._4_4_ == iVar69);
          auVar116._12_4_ = -(uint)(auVar117._12_4_ == iVar73);
          auVar116._0_4_ = auVar116._4_4_;
          auVar116._8_4_ = auVar116._12_4_;
          auVar118._4_4_ = auVar105._4_4_;
          auVar118._0_4_ = auVar105._4_4_;
          auVar118._8_4_ = auVar105._12_4_;
          auVar118._12_4_ = auVar105._12_4_;
          auVar98 = auVar116 & auVar131 | auVar118;
          auVar117 = packssdw(auVar105,auVar98);
          auVar16._8_4_ = 0xffffffff;
          auVar16._0_8_ = 0xffffffffffffffff;
          auVar16._12_4_ = 0xffffffff;
          auVar117 = packssdw(auVar117 ^ auVar16,auVar117 ^ auVar16);
          auVar117 = packsswb(auVar117,auVar117);
          if ((auVar117 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            puVar57[-0x38] = 0xff;
          }
          auVar117 = pshufhw(auVar117,auVar131,0x84);
          in_XMM2 = pshufhw(auVar98,auVar116,0x84);
          in_XMM2 = in_XMM2 & auVar117;
          auVar117 = pshufhw(auVar117,auVar118,0x84);
          auVar106._8_4_ = 0xffffffff;
          auVar106._0_8_ = 0xffffffffffffffff;
          auVar106._12_4_ = 0xffffffff;
          auVar106 = (auVar117 | in_XMM2) ^ auVar106;
          auVar117 = packssdw(auVar106,auVar106);
          in_XMM1 = packsswb(auVar117,auVar117);
          if ((in_XMM1._14_2_ >> 8 & 1) != 0) {
            puVar57[-0x3c] = 0xff;
          }
          uVar88 = uVar88 + 0x10;
          puVar57 = puVar57 + -0x40;
        } while ((uVar90 + 0x10 & 0x3ffffff0) != uVar88);
      }
      if ((int)sVar4 < 1) {
        uVar74 = s->img_x;
      }
      else {
        uVar74 = s->img_x;
        if (0 < (int)sVar81 >> 1) {
          uVar90 = uVar74 * iVar38;
          uVar79 = (sVar81 - 1) * uVar90;
          uVar88 = 0;
          uVar83 = 0;
          do {
            if (0 < (int)uVar90) {
              uVar87 = 0;
              do {
                uVar37 = puVar52[uVar87 + uVar88];
                puVar52[uVar87 + uVar88] = puVar52[uVar87 + uVar79];
                puVar52[uVar87 + uVar79] = uVar37;
                uVar87 = uVar87 + 1;
              } while (uVar90 != uVar87);
            }
            uVar83 = uVar83 + 1;
            uVar79 = uVar79 - uVar90;
            uVar88 = (ulong)((int)uVar88 + uVar90);
          } while (uVar83 != (uint)((int)sVar81 >> 1));
        }
      }
      if ((req_comp != 0) && (iVar38 != req_comp)) {
        puVar52 = stbi__convert_format(puVar52,iVar38,req_comp,uVar74,sVar81);
        if (puVar52 == (uchar *)0x0) {
          return (uchar *)0x0;
        }
        uVar74 = s->img_x;
      }
      *x = uVar74;
      *y = s->img_y;
      if (comp != (int *)0x0) {
        *comp = s->img_n;
        return puVar52;
      }
      return puVar52;
    }
    psVar58 = s->img_buffer_original;
    psVar76 = s->img_buffer_original_end;
    s->img_buffer = psVar58;
    s->img_buffer_end = psVar76;
    if (uVar74 == 0x7c) goto LAB_001150d7;
  }
  else {
    if (s->read_from_callbacks != 0) {
      psVar58 = s->buffer_start;
      iVar38 = (*(s->io).read)(s->io_user_data,(char *)psVar58,s->buflen);
      if (iVar38 == 0) {
        s->read_from_callbacks = 0;
        psVar76 = s->buffer_start + 1;
        s->buffer_start[0] = '\0';
        sVar34 = '\0';
      }
      else {
        psVar76 = psVar58 + iVar38;
        sVar34 = *psVar58;
      }
      s->img_buffer_end = psVar76;
      psVar59 = s->buffer_start + 1;
      s->img_buffer = psVar59;
      goto LAB_00114fd7;
    }
LAB_00115161:
    psVar58 = s->img_buffer_original;
    psVar76 = s->img_buffer_original_end;
    s->img_buffer = psVar58;
    s->img_buffer_end = psVar76;
  }
  if (psVar76 <= psVar58) {
    if (s->read_from_callbacks != 0) {
      psVar58 = s->buffer_start;
      iVar38 = (*(s->io).read)(s->io_user_data,(char *)psVar58,s->buflen);
      if (iVar38 == 0) {
        s->read_from_callbacks = 0;
        psVar76 = s->buffer_start + 1;
        s->buffer_start[0] = '\0';
        sVar34 = '\0';
      }
      else {
        psVar76 = psVar58 + iVar38;
        sVar34 = *psVar58;
      }
      s->img_buffer_end = psVar76;
      psVar59 = s->buffer_start + 1;
      s->img_buffer = psVar59;
      goto LAB_001151f2;
    }
LAB_00116e7b:
    s->img_buffer = s->img_buffer_original;
    s->img_buffer_end = s->img_buffer_original_end;
LAB_00116e8f:
    iVar38 = stbi__psd_test(s);
    if (iVar38 != 0) {
      psVar76 = stbi__psd_load(s,x,y,comp,req_comp);
      return psVar76;
    }
    iVar38 = stbi__pic_test(s);
    if (iVar38 != 0) {
      psVar76 = stbi__pic_load(s,x,y,comp,req_comp);
      return psVar76;
    }
    iVar38 = stbi__pnm_test(s);
    if (iVar38 != 0) {
      psVar76 = stbi__pnm_load(s,x,y,comp,req_comp);
      return psVar76;
    }
    iVar38 = stbi__hdr_test(s);
    if (iVar38 == 0) {
      iVar38 = stbi__tga_test(s);
      if (iVar38 == 0) {
        stbi__g_failure_reason = "unknown image type";
        return (uchar *)0x0;
      }
      psVar76 = stbi__tga_load(s,x,y,comp,req_comp);
      return psVar76;
    }
    data_00 = stbi__hdr_load(s,x,y,comp,req_comp);
    if (req_comp == 0) {
      req_comp = *comp;
    }
    psVar76 = stbi__hdr_to_ldr(data_00,*x,*y,req_comp);
    return psVar76;
  }
  psVar59 = psVar58 + 1;
  s->img_buffer = psVar59;
  sVar34 = *psVar58;
LAB_001151f2:
  if (sVar34 != 'G') goto LAB_00116e7b;
  if (psVar59 < psVar76) {
    psVar58 = psVar59 + 1;
    s->img_buffer = psVar58;
    sVar34 = *psVar59;
  }
  else {
    if (s->read_from_callbacks == 0) goto LAB_00116e7b;
    psVar58 = s->buffer_start;
    iVar38 = (*(s->io).read)(s->io_user_data,(char *)psVar58,s->buflen);
    if (iVar38 == 0) {
      s->read_from_callbacks = 0;
      psVar76 = s->buffer_start + 1;
      s->buffer_start[0] = '\0';
      sVar34 = '\0';
    }
    else {
      psVar76 = psVar58 + iVar38;
      sVar34 = *psVar58;
    }
    s->img_buffer_end = psVar76;
    psVar58 = s->buffer_start + 1;
    s->img_buffer = psVar58;
  }
  if (sVar34 != 'I') goto LAB_00116e7b;
  if (psVar58 < psVar76) {
    psVar59 = psVar58 + 1;
    s->img_buffer = psVar59;
    sVar34 = *psVar58;
  }
  else {
    if (s->read_from_callbacks == 0) goto LAB_00116e7b;
    psVar58 = s->buffer_start;
    iVar38 = (*(s->io).read)(s->io_user_data,(char *)psVar58,s->buflen);
    if (iVar38 == 0) {
      s->read_from_callbacks = 0;
      psVar76 = s->buffer_start + 1;
      s->buffer_start[0] = '\0';
      sVar34 = '\0';
    }
    else {
      psVar76 = psVar58 + iVar38;
      sVar34 = *psVar58;
    }
    s->img_buffer_end = psVar76;
    psVar59 = s->buffer_start + 1;
    s->img_buffer = psVar59;
  }
  if (sVar34 != 'F') goto LAB_00116e7b;
  if (psVar59 < psVar76) {
    psVar58 = psVar59 + 1;
    s->img_buffer = psVar58;
    sVar34 = *psVar59;
  }
  else {
    if (s->read_from_callbacks == 0) goto LAB_00116e7b;
    psVar58 = s->buffer_start;
    iVar38 = (*(s->io).read)(s->io_user_data,(char *)psVar58,s->buflen);
    if (iVar38 == 0) {
      s->read_from_callbacks = 0;
      psVar76 = s->buffer_start + 1;
      s->buffer_start[0] = '\0';
      sVar34 = '\0';
    }
    else {
      psVar76 = psVar58 + iVar38;
      sVar34 = *psVar58;
    }
    s->img_buffer_end = psVar76;
    psVar58 = s->buffer_start + 1;
    s->img_buffer = psVar58;
  }
  if (sVar34 != '8') goto LAB_00116e7b;
  if (psVar58 < psVar76) {
    psVar59 = psVar58 + 1;
    s->img_buffer = psVar59;
    sVar34 = *psVar58;
  }
  else {
    if (s->read_from_callbacks == 0) goto LAB_00116e7b;
    psVar58 = s->buffer_start;
    iVar38 = (*(s->io).read)(s->io_user_data,(char *)psVar58,s->buflen);
    if (iVar38 == 0) {
      s->read_from_callbacks = 0;
      psVar76 = s->buffer_start + 1;
      s->buffer_start[0] = '\0';
      sVar34 = '\0';
    }
    else {
      psVar76 = psVar58 + iVar38;
      sVar34 = *psVar58;
    }
    s->img_buffer_end = psVar76;
    psVar59 = s->buffer_start + 1;
    s->img_buffer = psVar59;
  }
  if ((sVar34 != '9') && (sVar34 != '7')) goto LAB_00116e7b;
  if (psVar59 < psVar76) {
    s->img_buffer = psVar59 + 1;
    sVar34 = *psVar59;
  }
  else {
    if (s->read_from_callbacks == 0) goto LAB_00116e7b;
    iVar38 = (*(s->io).read)(s->io_user_data,(char *)s->buffer_start,s->buflen);
    if (iVar38 == 0) {
      s->read_from_callbacks = 0;
      s->buffer_start[0] = '\0';
      sVar34 = '\0';
    }
    else {
      sVar34 = s->buffer_start[0];
    }
  }
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  if (sVar34 != 'a') goto LAB_00116e8f;
  g = (stbi__gif *)calloc(1,0x4860);
  iVar38 = stbi__gif_header(s,g,comp,0);
  pcVar5 = stbi__g_failure_reason;
  if (iVar38 == 0) goto LAB_0011755b;
  psVar76 = g->out;
  lVar80 = (long)g->w * 4;
  __size = g->h * lVar80;
  psVar58 = (stbi_uc *)malloc(__size);
  g->out = psVar58;
  if (psVar58 == (stbi_uc *)0x0) {
    stbi__g_failure_reason = "outofmem";
    goto LAB_00117569;
  }
  switch((uint)g->eflags >> 2 & 7) {
  case 0:
    iVar38 = 0;
    iVar46 = 0;
    iVar69 = (int)lVar80;
    iVar64 = (int)__size;
    goto LAB_001170f9;
  case 1:
    if (psVar76 != (stbi_uc *)0x0) {
      memcpy(psVar58,psVar76,__size);
    }
    g->old_out = psVar76;
    break;
  case 2:
    if (psVar76 != (stbi_uc *)0x0) {
      memcpy(psVar58,psVar76,__size);
    }
    iVar38 = g->start_x;
    iVar46 = g->start_y;
    iVar69 = g->max_x;
    iVar64 = g->max_y;
LAB_001170f9:
    stbi__fill_gif_background(g,iVar38,iVar46,iVar69,iVar64);
    break;
  case 3:
    if (g->old_out != (stbi_uc *)0x0) {
      for (iVar38 = g->start_y; iVar38 < g->max_y; iVar38 = iVar38 + g->w * 4) {
        lVar80 = (long)g->start_x + (long)iVar38;
        memcpy(g->out + lVar80,g->old_out + lVar80,(long)g->max_x - (long)g->start_x);
      }
    }
  }
  psVar76 = s->buffer_start;
  psVar58 = s->buffer_start + 1;
LAB_00117175:
  pbVar51 = s->img_buffer;
  psVar59 = s->img_buffer_end;
  if (pbVar51 < psVar59) {
    s->img_buffer = pbVar51 + 1;
    bVar35 = *pbVar51;
    psVar60 = pbVar51 + 1;
  }
  else {
    if (s->read_from_callbacks == 0) {
      pcVar5 = "unknown code";
      goto LAB_0011755b;
    }
    iVar38 = (*(s->io).read)(s->io_user_data,(char *)psVar76,s->buflen);
    if (iVar38 == 0) {
      s->read_from_callbacks = 0;
      s->buffer_start[0] = '\0';
      bVar35 = 0;
      psVar59 = psVar58;
    }
    else {
      bVar35 = *psVar76;
      psVar59 = psVar76 + iVar38;
    }
    s->img_buffer_end = psVar59;
    s->img_buffer = psVar58;
    psVar60 = psVar58;
  }
  if (bVar35 == 0x21) {
    if (psVar60 < psVar59) {
      s->img_buffer = psVar60 + 1;
      bVar35 = *psVar60;
      psVar60 = psVar60 + 1;
    }
    else {
      if (s->read_from_callbacks == 0) goto LAB_00117400;
      iVar38 = (*(s->io).read)(s->io_user_data,(char *)psVar76,s->buflen);
      if (iVar38 == 0) {
        s->read_from_callbacks = 0;
        s->buffer_start[0] = '\0';
        bVar35 = 0;
        psVar59 = psVar58;
      }
      else {
        bVar35 = *psVar76;
        psVar59 = psVar76 + iVar38;
      }
      s->img_buffer_end = psVar59;
      s->img_buffer = psVar58;
      psVar60 = psVar58;
    }
    if (bVar35 != 0xf9) goto LAB_00117400;
    if (psVar60 < psVar59) {
      s->img_buffer = psVar60 + 1;
      bVar35 = *psVar60;
      psVar60 = psVar60 + 1;
LAB_001172c8:
      if (bVar35 == 4) {
        if (psVar60 < psVar59) {
          s->img_buffer = psVar60 + 1;
          uVar74 = (uint)*psVar60;
        }
        else if (s->read_from_callbacks == 0) {
          uVar74 = 0;
        }
        else {
          iVar38 = (*(s->io).read)(s->io_user_data,(char *)psVar76,s->buflen);
          if (iVar38 == 0) {
            s->read_from_callbacks = 0;
            s->buffer_start[0] = '\0';
            uVar74 = 0;
            psVar59 = psVar58;
          }
          else {
            uVar74 = (uint)*psVar76;
            psVar59 = psVar76 + iVar38;
          }
          s->img_buffer_end = psVar59;
          s->img_buffer = psVar58;
        }
        g->eflags = uVar74;
        iVar38 = stbi__get16le(s);
        g->delay = iVar38;
        psVar60 = s->img_buffer;
        psVar59 = s->img_buffer_end;
        if (psVar60 < psVar59) {
          s->img_buffer = psVar60 + 1;
          bVar35 = *psVar60;
          psVar60 = psVar60 + 1;
        }
        else if (s->read_from_callbacks == 0) {
          bVar35 = 0;
        }
        else {
          iVar38 = (*(s->io).read)(s->io_user_data,(char *)psVar76,s->buflen);
          if (iVar38 == 0) {
            s->read_from_callbacks = 0;
            s->buffer_start[0] = '\0';
            bVar35 = 0;
            psVar59 = psVar58;
          }
          else {
            bVar35 = *psVar76;
            psVar59 = psVar76 + iVar38;
          }
          s->img_buffer_end = psVar59;
          s->img_buffer = psVar58;
          psVar60 = psVar58;
        }
        g->transparent = (uint)bVar35;
LAB_00117400:
        do {
          if (psVar60 < psVar59) {
            s->img_buffer = psVar60 + 1;
            bVar35 = *psVar60;
          }
          else {
            if (s->read_from_callbacks == 0) goto LAB_00117175;
            iVar38 = (*(s->io).read)(s->io_user_data,(char *)psVar76,s->buflen);
            if (iVar38 == 0) {
              s->read_from_callbacks = 0;
              s->buffer_start[0] = '\0';
              bVar35 = 0;
              psVar59 = psVar58;
            }
            else {
              bVar35 = *psVar76;
              psVar59 = psVar76 + iVar38;
            }
            s->img_buffer_end = psVar59;
            s->img_buffer = psVar58;
          }
          if (bVar35 == 0) goto LAB_00117175;
          stbi__skip(s,(uint)bVar35);
          psVar60 = s->img_buffer;
          psVar59 = s->img_buffer_end;
        } while( true );
      }
    }
    else {
      if (s->read_from_callbacks != 0) {
        iVar38 = (*(s->io).read)(s->io_user_data,(char *)psVar76,s->buflen);
        if (iVar38 == 0) {
          s->read_from_callbacks = 0;
          s->buffer_start[0] = '\0';
          bVar35 = 0;
          psVar59 = psVar58;
        }
        else {
          bVar35 = *psVar76;
          psVar59 = psVar76 + iVar38;
        }
        s->img_buffer_end = psVar59;
        s->img_buffer = psVar58;
        psVar60 = psVar58;
        goto LAB_001172c8;
      }
      bVar35 = 0;
    }
    stbi__skip(s,(uint)bVar35);
    goto LAB_00117175;
  }
  pcVar5 = stbi__g_failure_reason;
  if ((bVar35 != 0x3b) && (pcVar5 = "unknown code", bVar35 == 0x2c)) {
    iVar38 = stbi__get16le(s);
    iVar46 = stbi__get16le(s);
    iVar69 = stbi__get16le(s);
    iVar64 = stbi__get16le(s);
    pcVar5 = "bad Image Descriptor";
    if ((iVar69 + iVar38 <= g->w) && (iVar64 + iVar46 <= g->h)) {
      iVar73 = g->w * 4;
      g->line_size = iVar73;
      g->start_x = iVar38 << 2;
      g->start_y = iVar46 * iVar73;
      g->max_x = (iVar69 + iVar38) * 4;
      g->max_y = (iVar64 + iVar46) * iVar73;
      g->cur_x = iVar38 << 2;
      g->cur_y = iVar46 * iVar73;
      psVar59 = s->img_buffer;
      psVar60 = s->img_buffer_end;
      if (psVar59 < psVar60) {
        s->img_buffer = psVar59 + 1;
        bVar35 = *psVar59;
        psVar59 = psVar59 + 1;
LAB_001175e8:
        g->lflags = (uint)bVar35;
        iVar38 = iVar73 * 8;
        if ((bVar35 & 0x40) == 0) {
          iVar38 = iVar73;
        }
        g->step = iVar38;
        g->parse = (int)((uint)bVar35 << 0x19) >> 0x1f & 3;
        if (-1 < (char)bVar35) goto LAB_00117624;
        pal = g->lpal;
        local_4868 = 0xffffffff;
        iVar38 = -1;
        if ((g->eflags & 1) != 0) {
          iVar38 = g->transparent;
        }
        stbi__gif_parse_colortable(s,pal,2 << (bVar35 & 7),iVar38);
        psVar59 = s->img_buffer;
        psVar60 = s->img_buffer_end;
      }
      else {
        if (s->read_from_callbacks != 0) {
          iVar38 = (*(s->io).read)(s->io_user_data,(char *)psVar76,s->buflen);
          if (iVar38 == 0) {
            s->read_from_callbacks = 0;
            s->buffer_start[0] = '\0';
            bVar35 = 0;
            psVar60 = psVar58;
          }
          else {
            bVar35 = *psVar76;
            psVar60 = psVar76 + iVar38;
          }
          s->img_buffer_end = psVar60;
          s->img_buffer = psVar58;
          iVar73 = g->line_size;
          psVar59 = psVar58;
          goto LAB_001175e8;
        }
        g->lflags = 0;
        g->step = iVar73;
        g->parse = 0;
LAB_00117624:
        if ((g->flags & 0x80) == 0) {
          pcVar5 = "missing color table";
          goto LAB_0011755b;
        }
        lVar80 = (long)g->transparent;
        local_4868 = 0xffffffff;
        if ((-1 < lVar80) && ((g->eflags & 1) != 0)) {
          local_4868 = (uint)g->pal[lVar80][3];
          g->pal[lVar80][3] = '\0';
        }
        pal = g->pal;
      }
      g->color_table = *pal;
      if (psVar59 < psVar60) {
        s->img_buffer = psVar59 + 1;
        bVar35 = *psVar59;
      }
      else {
        if (s->read_from_callbacks == 0) {
          bVar35 = 0;
          goto LAB_0011773c;
        }
        iVar38 = (*(s->io).read)(s->io_user_data,(char *)psVar76,s->buflen);
        if (iVar38 == 0) {
          s->read_from_callbacks = 0;
          s->buffer_start[0] = '\0';
          bVar35 = 0;
          psVar59 = psVar58;
        }
        else {
          bVar35 = *psVar76;
          psVar59 = psVar76 + iVar38;
        }
        s->img_buffer_end = psVar59;
        s->img_buffer = psVar58;
      }
      pcVar5 = stbi__g_failure_reason;
      if (bVar35 < 0xd) {
LAB_0011773c:
        uVar74 = 1 << (bVar35 & 0x1f);
        uVar88 = 0;
        do {
          g->codes[uVar88].prefix = -1;
          g->codes[uVar88].first = (stbi_uc)uVar88;
          g->codes[uVar88].suffix = (stbi_uc)uVar88;
          uVar88 = uVar88 + 1;
        } while (uVar74 != uVar88);
        uVar48 = (2 << (bVar35 & 0x1f)) - 1;
        uVar65 = 0;
        iVar38 = 0;
        uVar90 = 0;
        bVar61 = 0;
        uVar79 = uVar74 + 2;
        uVar41 = 0xffffffff;
        iVar46 = bVar35 + 1;
        uVar47 = uVar48;
LAB_001177e6:
        do {
          for (; uVar49 = uVar47, iVar69 = iVar46, uVar71 = uVar41, uVar66 = uVar79, bVar29 = bVar61
              , iVar46 = iVar38 - iVar69, iVar38 < iVar69; iVar38 = iVar38 + 8) {
            psVar59 = s->img_buffer;
            psVar60 = s->img_buffer_end;
            if (uVar65 == 0) {
              if (psVar59 < psVar60) {
                s->img_buffer = psVar59 + 1;
                bVar61 = *psVar59;
                psVar59 = psVar59 + 1;
              }
              else {
                if (s->read_from_callbacks == 0) goto LAB_00117acd;
                iVar46 = (*(s->io).read)(s->io_user_data,(char *)psVar76,s->buflen);
                if (iVar46 == 0) {
                  s->read_from_callbacks = 0;
                  s->buffer_start[0] = '\0';
                  bVar61 = 0;
                  psVar60 = psVar58;
                }
                else {
                  bVar61 = *psVar76;
                  psVar60 = psVar76 + iVar46;
                }
                s->img_buffer_end = psVar60;
                s->img_buffer = psVar58;
                psVar59 = psVar58;
              }
              if (bVar61 == 0) goto LAB_00117acd;
              uVar65 = (uint)bVar61;
            }
            if (psVar59 < psVar60) {
              s->img_buffer = psVar59 + 1;
              uVar79 = (uint)*psVar59;
            }
            else if (s->read_from_callbacks == 0) {
              uVar79 = 0;
            }
            else {
              iVar46 = (*(s->io).read)(s->io_user_data,(char *)psVar76,s->buflen);
              if (iVar46 == 0) {
                s->read_from_callbacks = 0;
                s->buffer_start[0] = '\0';
                uVar79 = 0;
                psVar59 = psVar58;
              }
              else {
                uVar79 = (uint)*psVar76;
                psVar59 = psVar76 + iVar46;
              }
              s->img_buffer_end = psVar59;
              s->img_buffer = psVar58;
            }
            bVar61 = (byte)iVar38;
            uVar65 = uVar65 - 1;
            uVar90 = uVar90 | uVar79 << (bVar61 & 0x1f);
            bVar61 = bVar29;
            uVar79 = uVar66;
            uVar41 = uVar71;
            iVar46 = iVar69;
            uVar47 = uVar49;
          }
          uVar79 = (int)uVar90 >> ((byte)iVar69 & 0x1f);
          uVar86 = uVar90 & uVar49;
          iVar38 = iVar46;
          uVar90 = uVar79;
          bVar61 = 1;
          uVar79 = uVar74 + 2;
          uVar41 = 0xffffffff;
          iVar46 = bVar35 + 1;
          uVar47 = uVar48;
        } while (uVar86 == uVar74);
        if (uVar86 == uVar74 + 1) goto LAB_00117a40;
        if ((int)uVar66 < (int)uVar86) {
          pcVar5 = "illegal code in raster";
          goto LAB_0011755b;
        }
        pcVar5 = "no clear code";
        if ((bool)(bVar29 ^ 1)) goto LAB_0011755b;
        if ((int)uVar71 < 0) {
          if (uVar86 == uVar66) goto LAB_00117b54;
        }
        else {
          if (0xfff < (int)uVar66) {
            pcVar5 = "too many codes";
            goto LAB_0011755b;
          }
          g->codes[(int)uVar66].prefix = (stbi__int16)uVar71;
          sVar34 = g->codes[uVar71].first;
          g->codes[(int)uVar66].first = sVar34;
          if (uVar86 != uVar66 + 1) {
            sVar34 = g->codes[(int)uVar86].first;
          }
          g->codes[(int)uVar66].suffix = sVar34;
          uVar66 = uVar66 + 1;
        }
        stbi__out_gif_code(g,(stbi__uint16)uVar86);
        bVar61 = 1;
        uVar79 = uVar66;
        uVar41 = uVar86;
        iVar46 = iVar69 + 1;
        uVar47 = ~(-1 << ((byte)(iVar69 + 1) & 0x1f));
        if (0xfff < (int)uVar66 || (uVar66 & uVar49) != 0) {
          iVar46 = iVar69;
          uVar47 = uVar49;
        }
        goto LAB_001177e6;
      }
    }
  }
LAB_0011755b:
  stbi__g_failure_reason = pcVar5;
  if (g->out != (stbi_uc *)0x0) {
    free(g->out);
  }
LAB_00117569:
  data = (stbi__context *)0x0;
LAB_00115cbb:
  free(g);
  return (uchar *)data;
LAB_001170b1:
  g->codes[0xfbd] = (stbi__gif_lzw)((int)sVar77 + -0x10);
LAB_001170bb:
  stbi__g_failure_reason = "bad huffman code";
  goto LAB_00115cac;
LAB_00117a40:
  stbi__skip(s,uVar65);
  pbVar51 = s->img_buffer;
  if (pbVar51 < s->img_buffer_end) {
    s->img_buffer = pbVar51 + 1;
    bVar35 = *pbVar51;
  }
  else {
    if (s->read_from_callbacks == 0) goto LAB_00117acd;
    iVar38 = (*(s->io).read)(s->io_user_data,(char *)psVar76,s->buflen);
    if (iVar38 == 0) {
      s->read_from_callbacks = 0;
      s->buffer_start[0] = '\0';
      bVar35 = 0;
      psVar59 = psVar58;
    }
    else {
      bVar35 = *psVar76;
      psVar59 = psVar76 + iVar38;
    }
    s->img_buffer_end = psVar59;
    s->img_buffer = psVar58;
  }
  if (bVar35 == 0) goto LAB_00117acd;
  uVar65 = (uint)bVar35;
  goto LAB_00117a40;
LAB_00117acd:
  data = (stbi__context *)g->out;
  if (data != (stbi__context *)0x0) {
    if (local_4868 != 0xffffffff) {
      g->pal[g->transparent][3] = (stbi_uc)local_4868;
    }
    pcVar5 = stbi__g_failure_reason;
    if (data != s) {
      uVar74 = g->w;
      *x = uVar74;
      uVar90 = g->h;
      *y = uVar90;
      if ((req_comp & 0xfffffffbU) != 0) {
        data = (stbi__context *)stbi__convert_format((uchar *)data,4,req_comp,uVar74,uVar90);
      }
      goto LAB_00115cbb;
    }
    goto LAB_0011755b;
  }
  goto LAB_00117569;
LAB_00117b54:
  pcVar5 = "illegal code in raster";
  goto LAB_0011755b;
}

Assistant:

static unsigned char *stbi__load_main(stbi__context *s, int *x, int *y, int *comp, int req_comp)
{
   #ifndef STBI_NO_JPEG
   if (stbi__jpeg_test(s)) return stbi__jpeg_load(s,x,y,comp,req_comp);
   #endif
   #ifndef STBI_NO_PNG
   if (stbi__png_test(s))  return stbi__png_load(s,x,y,comp,req_comp);
   #endif
   #ifndef STBI_NO_BMP
   if (stbi__bmp_test(s))  return stbi__bmp_load(s,x,y,comp,req_comp);
   #endif
   #ifndef STBI_NO_GIF
   if (stbi__gif_test(s))  return stbi__gif_load(s,x,y,comp,req_comp);
   #endif
   #ifndef STBI_NO_PSD
   if (stbi__psd_test(s))  return stbi__psd_load(s,x,y,comp,req_comp);
   #endif
   #ifndef STBI_NO_PIC
   if (stbi__pic_test(s))  return stbi__pic_load(s,x,y,comp,req_comp);
   #endif
   #ifndef STBI_NO_PNM
   if (stbi__pnm_test(s))  return stbi__pnm_load(s,x,y,comp,req_comp);
   #endif

   #ifndef STBI_NO_HDR
   if (stbi__hdr_test(s)) {
      float *hdr = stbi__hdr_load(s, x,y,comp,req_comp);
      return stbi__hdr_to_ldr(hdr, *x, *y, req_comp ? req_comp : *comp);
   }
   #endif

   #ifndef STBI_NO_TGA
   // test tga last because it's a crappy test!
   if (stbi__tga_test(s))
      return stbi__tga_load(s,x,y,comp,req_comp);
   #endif

   return stbi__errpuc("unknown image type", "Image not of any known type, or corrupt");
}